

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_hn<embree::sse2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  Primitive *pPVar4;
  Primitive PVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined3 uVar21;
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  int iVar24;
  undefined8 uVar25;
  BBox1f BVar26;
  undefined6 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  bool bVar46;
  bool bVar47;
  byte bVar48;
  uint uVar49;
  ulong uVar50;
  ulong uVar51;
  RTCFilterFunctionN p_Var52;
  RTCRayN *pRVar53;
  undefined4 uVar54;
  undefined8 unaff_RBX;
  bool bVar55;
  uint uVar56;
  int iVar57;
  uint uVar58;
  int iVar59;
  uint uVar60;
  uint uVar61;
  float fVar62;
  float fVar92;
  float fVar93;
  vfloat_impl<4> p00;
  undefined1 auVar63 [16];
  undefined2 uVar91;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar74 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  short sVar94;
  float fVar95;
  float fVar128;
  float fVar129;
  undefined1 auVar96 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float t1;
  float fVar130;
  float fVar140;
  float fVar141;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar144;
  float fVar149;
  float fVar150;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar151;
  float fVar164;
  float fVar165;
  vfloat4 v;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar166;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar167;
  float fVar168;
  float fVar182;
  float fVar184;
  vfloat4 a;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar183;
  float fVar185;
  float fVar186;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  float fVar187;
  float fVar188;
  float fVar204;
  float fVar206;
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar195 [16];
  undefined1 auVar198 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar207;
  float fVar208;
  undefined1 auVar203 [16];
  float fVar209;
  float fVar218;
  float fVar220;
  undefined1 auVar210 [16];
  float fVar219;
  float fVar221;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar222;
  float fVar233;
  float fVar234;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar235;
  float fVar245;
  float fVar248;
  undefined1 auVar237 [16];
  float fVar236;
  float fVar246;
  float fVar247;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar280;
  float fVar285;
  vfloat4 a_1;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar305;
  float fVar309;
  undefined1 auVar298 [16];
  float fVar313;
  undefined1 auVar301 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar314;
  float fVar315;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar323;
  float fVar325;
  float fVar327;
  undefined1 auVar319 [16];
  float fVar324;
  float fVar326;
  float fVar328;
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  float fVar329;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  float fVar336;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar337 [16];
  byte local_52c;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  BBox1f local_508;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined1 local_418 [8];
  undefined8 uStack_410;
  undefined1 local_408 [16];
  undefined1 (*local_3f0) [16];
  Primitive *local_3e8;
  ulong local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [16];
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 uVar127;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  
  PVar5 = prim[1];
  uVar50 = (ulong)(byte)PVar5;
  pPVar4 = prim + uVar50 * 0x19 + 6;
  fVar150 = *(float *)(pPVar4 + 0xc);
  uVar49 = *(uint *)(ray + k * 4 + 0x30);
  _local_418 = ZEXT416(uVar49);
  fVar151 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar150;
  fVar164 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar150;
  fVar165 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar150;
  fVar144 = *(float *)(ray + k * 4 + 0x40) * fVar150;
  fVar149 = *(float *)(ray + k * 4 + 0x50) * fVar150;
  fVar150 = *(float *)(ray + k * 4 + 0x60) * fVar150;
  uVar54 = *(undefined4 *)(prim + uVar50 * 4 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar98._8_4_ = 0;
  auVar98._0_8_ = uVar51;
  auVar98._12_2_ = uVar91;
  auVar98._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar97._12_4_ = auVar98._12_4_;
  auVar97._8_2_ = 0;
  auVar97._0_8_ = uVar51;
  auVar97._10_2_ = uVar91;
  auVar96._10_6_ = auVar97._10_6_;
  auVar96._8_2_ = uVar91;
  auVar96._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar28._4_8_ = auVar96._8_8_;
  auVar28._2_2_ = uVar91;
  auVar28._0_2_ = uVar91;
  fVar130 = (float)((int)sVar94 >> 8);
  fVar140 = (float)(auVar28._0_4_ >> 0x18);
  fVar141 = (float)(auVar96._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 5 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar51;
  auVar101._12_2_ = uVar91;
  auVar101._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar51;
  auVar100._10_2_ = uVar91;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar91;
  auVar99._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar29._4_8_ = auVar99._8_8_;
  auVar29._2_2_ = uVar91;
  auVar29._0_2_ = uVar91;
  fVar167 = (float)((int)sVar94 >> 8);
  fVar182 = (float)(auVar29._0_4_ >> 0x18);
  fVar184 = (float)(auVar99._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 6 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar51;
  auVar104._12_2_ = uVar91;
  auVar104._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar51;
  auVar103._10_2_ = uVar91;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar91;
  auVar102._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar30._4_8_ = auVar102._8_8_;
  auVar30._2_2_ = uVar91;
  auVar30._0_2_ = uVar91;
  fVar222 = (float)((int)sVar94 >> 8);
  fVar233 = (float)(auVar30._0_4_ >> 0x18);
  fVar234 = (float)(auVar102._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0xb + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar51;
  auVar107._12_2_ = uVar91;
  auVar107._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar51;
  auVar106._10_2_ = uVar91;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar91;
  auVar105._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar31._4_8_ = auVar105._8_8_;
  auVar31._2_2_ = uVar91;
  auVar31._0_2_ = uVar91;
  fVar62 = (float)((int)sVar94 >> 8);
  fVar92 = (float)(auVar31._0_4_ >> 0x18);
  fVar93 = (float)(auVar105._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0xc + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar51;
  auVar191._12_2_ = uVar91;
  auVar191._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar51;
  auVar190._10_2_ = uVar91;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar91;
  auVar189._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar32._4_8_ = auVar189._8_8_;
  auVar32._2_2_ = uVar91;
  auVar32._0_2_ = uVar91;
  fVar209 = (float)((int)sVar94 >> 8);
  fVar218 = (float)(auVar32._0_4_ >> 0x18);
  fVar220 = (float)(auVar189._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0xd + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar194._8_4_ = 0;
  auVar194._0_8_ = uVar51;
  auVar194._12_2_ = uVar91;
  auVar194._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar193._12_4_ = auVar194._12_4_;
  auVar193._8_2_ = 0;
  auVar193._0_8_ = uVar51;
  auVar193._10_2_ = uVar91;
  auVar192._10_6_ = auVar193._10_6_;
  auVar192._8_2_ = uVar91;
  auVar192._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar33._4_8_ = auVar192._8_8_;
  auVar33._2_2_ = uVar91;
  auVar33._0_2_ = uVar91;
  fVar253 = (float)((int)sVar94 >> 8);
  fVar261 = (float)(auVar33._0_4_ >> 0x18);
  fVar264 = (float)(auVar192._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0x12 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar197._8_4_ = 0;
  auVar197._0_8_ = uVar51;
  auVar197._12_2_ = uVar91;
  auVar197._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar196._12_4_ = auVar197._12_4_;
  auVar196._8_2_ = 0;
  auVar196._0_8_ = uVar51;
  auVar196._10_2_ = uVar91;
  auVar195._10_6_ = auVar196._10_6_;
  auVar195._8_2_ = uVar91;
  auVar195._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar34._4_8_ = auVar195._8_8_;
  auVar34._2_2_ = uVar91;
  auVar34._0_2_ = uVar91;
  fVar235 = (float)((int)sVar94 >> 8);
  fVar245 = (float)(auVar34._0_4_ >> 0x18);
  fVar248 = (float)(auVar195._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0x13 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar200._8_4_ = 0;
  auVar200._0_8_ = uVar51;
  auVar200._12_2_ = uVar91;
  auVar200._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar199._12_4_ = auVar200._12_4_;
  auVar199._8_2_ = 0;
  auVar199._0_8_ = uVar51;
  auVar199._10_2_ = uVar91;
  auVar198._10_6_ = auVar199._10_6_;
  auVar198._8_2_ = uVar91;
  auVar198._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar35._4_8_ = auVar198._8_8_;
  auVar35._2_2_ = uVar91;
  auVar35._0_2_ = uVar91;
  fVar271 = (float)((int)sVar94 >> 8);
  fVar280 = (float)(auVar35._0_4_ >> 0x18);
  fVar285 = (float)(auVar198._8_4_ >> 0x18);
  uVar54 = *(undefined4 *)(prim + uVar50 * 0x14 + 6);
  uVar127 = (undefined1)((uint)uVar54 >> 0x18);
  uVar91 = CONCAT11(uVar127,uVar127);
  uVar127 = (undefined1)((uint)uVar54 >> 0x10);
  uVar25 = CONCAT35(CONCAT21(uVar91,uVar127),CONCAT14(uVar127,uVar54));
  uVar127 = (undefined1)((uint)uVar54 >> 8);
  uVar27 = CONCAT51(CONCAT41((int)((ulong)uVar25 >> 0x20),uVar127),uVar127);
  sVar94 = CONCAT11((char)uVar54,(char)uVar54);
  uVar51 = CONCAT62(uVar27,sVar94);
  auVar300._8_4_ = 0;
  auVar300._0_8_ = uVar51;
  auVar300._12_2_ = uVar91;
  auVar300._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar25 >> 0x20);
  auVar299._12_4_ = auVar300._12_4_;
  auVar299._8_2_ = 0;
  auVar299._0_8_ = uVar51;
  auVar299._10_2_ = uVar91;
  auVar298._10_6_ = auVar299._10_6_;
  auVar298._8_2_ = uVar91;
  auVar298._0_8_ = uVar51;
  uVar91 = (undefined2)uVar27;
  auVar36._4_8_ = auVar298._8_8_;
  auVar36._2_2_ = uVar91;
  auVar36._0_2_ = uVar91;
  fVar95 = (float)((int)sVar94 >> 8);
  fVar128 = (float)(auVar36._0_4_ >> 0x18);
  fVar129 = (float)(auVar298._8_4_ >> 0x18);
  fVar316 = fVar144 * fVar130 + fVar149 * fVar167 + fVar150 * fVar222;
  fVar323 = fVar144 * fVar140 + fVar149 * fVar182 + fVar150 * fVar233;
  fVar325 = fVar144 * fVar141 + fVar149 * fVar184 + fVar150 * fVar234;
  fVar327 = fVar144 * (float)(auVar97._12_4_ >> 0x18) +
            fVar149 * (float)(auVar100._12_4_ >> 0x18) + fVar150 * (float)(auVar103._12_4_ >> 0x18);
  fVar294 = fVar144 * fVar62 + fVar149 * fVar209 + fVar150 * fVar253;
  fVar305 = fVar144 * fVar92 + fVar149 * fVar218 + fVar150 * fVar261;
  fVar309 = fVar144 * fVar93 + fVar149 * fVar220 + fVar150 * fVar264;
  fVar313 = fVar144 * (float)(auVar106._12_4_ >> 0x18) +
            fVar149 * (float)(auVar190._12_4_ >> 0x18) + fVar150 * (float)(auVar193._12_4_ >> 0x18);
  fVar187 = fVar144 * fVar235 + fVar149 * fVar271 + fVar150 * fVar95;
  fVar204 = fVar144 * fVar245 + fVar149 * fVar280 + fVar150 * fVar128;
  fVar206 = fVar144 * fVar248 + fVar149 * fVar285 + fVar150 * fVar129;
  fVar144 = fVar144 * (float)(auVar196._12_4_ >> 0x18) +
            fVar149 * (float)(auVar199._12_4_ >> 0x18) + fVar150 * (float)(auVar299._12_4_ >> 0x18);
  fVar167 = fVar130 * fVar151 + fVar167 * fVar164 + fVar222 * fVar165;
  fVar182 = fVar140 * fVar151 + fVar182 * fVar164 + fVar233 * fVar165;
  fVar184 = fVar141 * fVar151 + fVar184 * fVar164 + fVar234 * fVar165;
  fVar222 = (float)(auVar97._12_4_ >> 0x18) * fVar151 +
            (float)(auVar100._12_4_ >> 0x18) * fVar164 + (float)(auVar103._12_4_ >> 0x18) * fVar165;
  fVar233 = fVar62 * fVar151 + fVar209 * fVar164 + fVar253 * fVar165;
  fVar234 = fVar92 * fVar151 + fVar218 * fVar164 + fVar261 * fVar165;
  fVar253 = fVar93 * fVar151 + fVar220 * fVar164 + fVar264 * fVar165;
  fVar261 = (float)(auVar106._12_4_ >> 0x18) * fVar151 +
            (float)(auVar190._12_4_ >> 0x18) * fVar164 + (float)(auVar193._12_4_ >> 0x18) * fVar165;
  fVar209 = fVar151 * fVar235 + fVar164 * fVar271 + fVar165 * fVar95;
  fVar218 = fVar151 * fVar245 + fVar164 * fVar280 + fVar165 * fVar128;
  fVar220 = fVar151 * fVar248 + fVar164 * fVar285 + fVar165 * fVar129;
  fVar151 = fVar151 * (float)(auVar196._12_4_ >> 0x18) +
            fVar164 * (float)(auVar199._12_4_ >> 0x18) + fVar165 * (float)(auVar299._12_4_ >> 0x18);
  fVar150 = (float)DAT_01f4bd50;
  fVar62 = DAT_01f4bd50._4_4_;
  fVar92 = DAT_01f4bd50._8_4_;
  fVar93 = DAT_01f4bd50._12_4_;
  uVar56 = -(uint)(fVar150 <= ABS(fVar316));
  uVar58 = -(uint)(fVar62 <= ABS(fVar323));
  uVar60 = -(uint)(fVar92 <= ABS(fVar325));
  uVar61 = -(uint)(fVar93 <= ABS(fVar327));
  auVar319._0_4_ = (uint)fVar316 & uVar56;
  auVar319._4_4_ = (uint)fVar323 & uVar58;
  auVar319._8_4_ = (uint)fVar325 & uVar60;
  auVar319._12_4_ = (uint)fVar327 & uVar61;
  auVar152._0_4_ = ~uVar56 & (uint)fVar150;
  auVar152._4_4_ = ~uVar58 & (uint)fVar62;
  auVar152._8_4_ = ~uVar60 & (uint)fVar92;
  auVar152._12_4_ = ~uVar61 & (uint)fVar93;
  auVar152 = auVar152 | auVar319;
  uVar56 = -(uint)(fVar150 <= ABS(fVar294));
  uVar58 = -(uint)(fVar62 <= ABS(fVar305));
  uVar60 = -(uint)(fVar92 <= ABS(fVar309));
  uVar61 = -(uint)(fVar93 <= ABS(fVar313));
  auVar301._0_4_ = (uint)fVar294 & uVar56;
  auVar301._4_4_ = (uint)fVar305 & uVar58;
  auVar301._8_4_ = (uint)fVar309 & uVar60;
  auVar301._12_4_ = (uint)fVar313 & uVar61;
  auVar169._0_4_ = ~uVar56 & (uint)fVar150;
  auVar169._4_4_ = ~uVar58 & (uint)fVar62;
  auVar169._8_4_ = ~uVar60 & (uint)fVar92;
  auVar169._12_4_ = ~uVar61 & (uint)fVar93;
  auVar169 = auVar169 | auVar301;
  uVar56 = -(uint)(fVar150 <= ABS(fVar187));
  uVar58 = -(uint)(fVar62 <= ABS(fVar204));
  uVar60 = -(uint)(fVar92 <= ABS(fVar206));
  uVar61 = -(uint)(fVar93 <= ABS(fVar144));
  auVar201._0_4_ = (uint)fVar187 & uVar56;
  auVar201._4_4_ = (uint)fVar204 & uVar58;
  auVar201._8_4_ = (uint)fVar206 & uVar60;
  auVar201._12_4_ = (uint)fVar144 & uVar61;
  auVar237._0_4_ = ~uVar56 & (uint)fVar150;
  auVar237._4_4_ = ~uVar58 & (uint)fVar62;
  auVar237._8_4_ = ~uVar60 & (uint)fVar92;
  auVar237._12_4_ = ~uVar61 & (uint)fVar93;
  auVar237 = auVar237 | auVar201;
  auVar63 = rcpps(_DAT_01f4bd50,auVar152);
  fVar150 = auVar63._0_4_;
  fVar93 = auVar63._4_4_;
  fVar129 = auVar63._8_4_;
  fVar141 = auVar63._12_4_;
  fVar150 = (1.0 - auVar152._0_4_ * fVar150) * fVar150 + fVar150;
  fVar93 = (1.0 - auVar152._4_4_ * fVar93) * fVar93 + fVar93;
  fVar129 = (1.0 - auVar152._8_4_ * fVar129) * fVar129 + fVar129;
  fVar141 = (1.0 - auVar152._12_4_ * fVar141) * fVar141 + fVar141;
  auVar63 = rcpps(auVar63,auVar169);
  fVar62 = auVar63._0_4_;
  fVar95 = auVar63._4_4_;
  fVar130 = auVar63._8_4_;
  fVar144 = auVar63._12_4_;
  fVar62 = (1.0 - auVar169._0_4_ * fVar62) * fVar62 + fVar62;
  fVar95 = (1.0 - auVar169._4_4_ * fVar95) * fVar95 + fVar95;
  fVar130 = (1.0 - auVar169._8_4_ * fVar130) * fVar130 + fVar130;
  fVar144 = (1.0 - auVar169._12_4_ * fVar144) * fVar144 + fVar144;
  auVar63 = rcpps(auVar63,auVar237);
  fVar92 = auVar63._0_4_;
  fVar128 = auVar63._4_4_;
  fVar140 = auVar63._8_4_;
  fVar149 = auVar63._12_4_;
  fVar92 = (1.0 - auVar237._0_4_ * fVar92) * fVar92 + fVar92;
  fVar128 = (1.0 - auVar237._4_4_ * fVar128) * fVar128 + fVar128;
  fVar140 = (1.0 - auVar237._8_4_ * fVar140) * fVar140 + fVar140;
  fVar149 = (1.0 - auVar237._12_4_ * fVar149) * fVar149 + fVar149;
  uVar51 = *(ulong *)(prim + uVar50 * 7 + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar51;
  auVar112._12_2_ = uVar91;
  auVar112._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar171._12_4_ = auVar112._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar51;
  auVar171._10_2_ = uVar91;
  auVar63._10_6_ = auVar171._10_6_;
  auVar63._8_2_ = uVar91;
  auVar63._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar37._4_8_ = auVar63._8_8_;
  auVar37._2_2_ = uVar91;
  auVar37._0_2_ = uVar91;
  auVar153._0_8_ =
       CONCAT44(((float)(auVar37._0_4_ >> 0x10) - fVar182) * fVar93,
                ((float)(int)(short)uVar51 - fVar167) * fVar150);
  auVar153._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar184) * fVar129;
  auVar153._12_4_ = ((float)(auVar171._12_4_ >> 0x10) - fVar222) * fVar141;
  uVar51 = *(ulong *)(prim + uVar50 * 9 + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar133._8_4_ = 0;
  auVar133._0_8_ = uVar51;
  auVar133._12_2_ = uVar91;
  auVar133._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar239._12_4_ = auVar133._12_4_;
  auVar239._8_2_ = 0;
  auVar239._0_8_ = uVar51;
  auVar239._10_2_ = uVar91;
  auVar64._10_6_ = auVar239._10_6_;
  auVar64._8_2_ = uVar91;
  auVar64._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar38._4_8_ = auVar64._8_8_;
  auVar38._2_2_ = uVar91;
  auVar38._0_2_ = uVar91;
  auVar202._0_4_ = ((float)(int)(short)uVar51 - fVar167) * fVar150;
  auVar202._4_4_ = ((float)(auVar38._0_4_ >> 0x10) - fVar182) * fVar93;
  auVar202._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar184) * fVar129;
  auVar202._12_4_ = ((float)(auVar239._12_4_ >> 0x10) - fVar222) * fVar141;
  uVar51 = *(ulong *)(prim + uVar50 * 0xe + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar67._8_4_ = 0;
  auVar67._0_8_ = uVar51;
  auVar67._12_2_ = uVar91;
  auVar67._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar66._12_4_ = auVar67._12_4_;
  auVar66._8_2_ = 0;
  auVar66._0_8_ = uVar51;
  auVar66._10_2_ = uVar91;
  auVar65._10_6_ = auVar66._10_6_;
  auVar65._8_2_ = uVar91;
  auVar65._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar39._4_8_ = auVar65._8_8_;
  auVar39._2_2_ = uVar91;
  auVar39._0_2_ = uVar91;
  auVar131._0_8_ =
       CONCAT44(((float)(auVar39._0_4_ >> 0x10) - fVar234) * fVar95,
                ((float)(int)(short)uVar51 - fVar233) * fVar62);
  auVar131._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar253) * fVar130;
  auVar131._12_4_ = ((float)(auVar66._12_4_ >> 0x10) - fVar261) * fVar144;
  uVar51 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar70._8_4_ = 0;
  auVar70._0_8_ = uVar51;
  auVar70._12_2_ = uVar91;
  auVar70._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar69._12_4_ = auVar70._12_4_;
  auVar69._8_2_ = 0;
  auVar69._0_8_ = uVar51;
  auVar69._10_2_ = uVar91;
  auVar68._10_6_ = auVar69._10_6_;
  auVar68._8_2_ = uVar91;
  auVar68._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar40._4_8_ = auVar68._8_8_;
  auVar40._2_2_ = uVar91;
  auVar40._0_2_ = uVar91;
  auVar223._0_4_ = ((float)(int)(short)uVar51 - fVar233) * fVar62;
  auVar223._4_4_ = ((float)(auVar40._0_4_ >> 0x10) - fVar234) * fVar95;
  auVar223._8_4_ = ((float)(auVar68._8_4_ >> 0x10) - fVar253) * fVar130;
  auVar223._12_4_ = ((float)(auVar69._12_4_ >> 0x10) - fVar261) * fVar144;
  uVar51 = *(ulong *)(prim + uVar50 * 0x15 + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar73._8_4_ = 0;
  auVar73._0_8_ = uVar51;
  auVar73._12_2_ = uVar91;
  auVar73._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar72._12_4_ = auVar73._12_4_;
  auVar72._8_2_ = 0;
  auVar72._0_8_ = uVar51;
  auVar72._10_2_ = uVar91;
  auVar71._10_6_ = auVar72._10_6_;
  auVar71._8_2_ = uVar91;
  auVar71._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar41._4_8_ = auVar71._8_8_;
  auVar41._2_2_ = uVar91;
  auVar41._0_2_ = uVar91;
  auVar108._0_8_ =
       CONCAT44(((float)(auVar41._0_4_ >> 0x10) - fVar218) * fVar128,
                ((float)(int)(short)uVar51 - fVar209) * fVar92);
  auVar108._8_4_ = ((float)(auVar71._8_4_ >> 0x10) - fVar220) * fVar140;
  auVar108._12_4_ = ((float)(auVar72._12_4_ >> 0x10) - fVar151) * fVar149;
  uVar51 = *(ulong *)(prim + uVar50 * 0x17 + 6);
  uVar91 = (undefined2)(uVar51 >> 0x30);
  auVar76._8_4_ = 0;
  auVar76._0_8_ = uVar51;
  auVar76._12_2_ = uVar91;
  auVar76._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar51 >> 0x20);
  auVar75._12_4_ = auVar76._12_4_;
  auVar75._8_2_ = 0;
  auVar75._0_8_ = uVar51;
  auVar75._10_2_ = uVar91;
  auVar74._10_6_ = auVar75._10_6_;
  auVar74._8_2_ = uVar91;
  auVar74._0_8_ = uVar51;
  uVar91 = (undefined2)(uVar51 >> 0x10);
  auVar42._4_8_ = auVar74._8_8_;
  auVar42._2_2_ = uVar91;
  auVar42._0_2_ = uVar91;
  auVar77._0_4_ = ((float)(int)(short)uVar51 - fVar209) * fVar92;
  auVar77._4_4_ = ((float)(auVar42._0_4_ >> 0x10) - fVar218) * fVar128;
  auVar77._8_4_ = ((float)(auVar74._8_4_ >> 0x10) - fVar220) * fVar140;
  auVar77._12_4_ = ((float)(auVar75._12_4_ >> 0x10) - fVar151) * fVar149;
  auVar170._8_4_ = auVar153._8_4_;
  auVar170._0_8_ = auVar153._0_8_;
  auVar170._12_4_ = auVar153._12_4_;
  auVar171 = minps(auVar170,auVar202);
  auVar145._8_4_ = auVar131._8_4_;
  auVar145._0_8_ = auVar131._0_8_;
  auVar145._12_4_ = auVar131._12_4_;
  auVar63 = minps(auVar145,auVar223);
  auVar171 = maxps(auVar171,auVar63);
  auVar146._8_4_ = auVar108._8_4_;
  auVar146._0_8_ = auVar108._0_8_;
  auVar146._12_4_ = auVar108._12_4_;
  auVar63 = minps(auVar146,auVar77);
  auVar210._4_4_ = uVar49;
  auVar210._0_4_ = uVar49;
  auVar210._8_4_ = uVar49;
  auVar210._12_4_ = uVar49;
  auVar63 = maxps(auVar63,auVar210);
  auVar63 = maxps(auVar171,auVar63);
  fVar150 = auVar63._0_4_ * 0.99999964;
  fVar62 = auVar63._4_4_ * 0.99999964;
  fVar92 = auVar63._8_4_ * 0.99999964;
  fVar93 = auVar63._12_4_ * 0.99999964;
  auVar171 = maxps(auVar153,auVar202);
  auVar63 = maxps(auVar131,auVar223);
  auVar171 = minps(auVar171,auVar63);
  auVar63 = maxps(auVar108,auVar77);
  uVar54 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar78._4_4_ = uVar54;
  auVar78._0_4_ = uVar54;
  auVar78._8_4_ = uVar54;
  auVar78._12_4_ = uVar54;
  auVar63 = minps(auVar63,auVar78);
  auVar63 = minps(auVar171,auVar63);
  auVar109._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && fVar150 <= auVar63._0_4_ * 1.0000004);
  auVar109._4_4_ = -(uint)(1 < (byte)PVar5 && fVar62 <= auVar63._4_4_ * 1.0000004);
  auVar109._8_4_ = -(uint)(2 < (byte)PVar5 && fVar92 <= auVar63._8_4_ * 1.0000004);
  auVar109._12_4_ = -(uint)(3 < (byte)PVar5 && fVar93 <= auVar63._12_4_ * 1.0000004);
  uVar54 = movmskps((int)unaff_RBX,auVar109);
  local_3e0 = CONCAT44((int)((ulong)unaff_RBX >> 0x20),uVar54);
  local_3f0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar13 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar14 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar15 = (int)mm_lookupmask_ps._248_4_ < 0;
  local_3e8 = prim;
LAB_002f2715:
  if (local_3e0 == 0) {
LAB_002f479d:
    return local_3e0 != 0;
  }
  lVar9 = 0;
  if (local_3e0 != 0) {
    for (; (local_3e0 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
    }
  }
  uVar49 = *(uint *)(local_3e8 + 2);
  uVar56 = *(uint *)(local_3e8 + lVar9 * 4 + 6);
  uVar51 = (ulong)uVar56;
  pGVar6 = (context->scene->geometries).items[uVar49].ptr;
  lVar7 = *(long *)&pGVar6[1].time_range.upper;
  uVar50 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           uVar51 * pGVar6[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i);
  pfVar1 = (float *)(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar50);
  fVar130 = *pfVar1;
  fVar140 = pfVar1[1];
  fVar141 = pfVar1[2];
  fVar144 = pfVar1[3];
  lVar9 = uVar50 + 1;
  pfVar1 = (float *)(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar9);
  fVar149 = *pfVar1;
  fVar167 = pfVar1[1];
  fVar182 = pfVar1[2];
  fVar184 = pfVar1[3];
  _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar1 = (float *)(_Var8 + (long)pGVar6[2].userPtr * uVar50);
  fVar222 = *pfVar1;
  fVar209 = pfVar1[1];
  fVar218 = pfVar1[2];
  fVar220 = pfVar1[3];
  pfVar1 = (float *)(_Var8 + (long)pGVar6[2].userPtr * lVar9);
  fVar151 = *pfVar1;
  fVar164 = pfVar1[1];
  fVar165 = pfVar1[2];
  fVar187 = pfVar1[3];
  pfVar1 = (float *)((long)pGVar6[3].userPtr + uVar50 * *(long *)&pGVar6[3].fnumTimeSegments);
  pfVar2 = (float *)((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar9);
  pfVar3 = (float *)(pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar50);
  fVar95 = *(float *)(ray + k * 4);
  fVar128 = *(float *)(ray + k * 4 + 0x10);
  fVar129 = *(float *)(ray + k * 4 + 0x20);
  fVar204 = *pfVar3 * 0.33333334 + fVar130;
  fVar206 = pfVar3[1] * 0.33333334 + fVar140;
  fVar233 = pfVar3[2] * 0.33333334 + fVar141;
  fVar234 = pfVar3[3] * 0.33333334 + fVar144;
  pfVar3 = (float *)(pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar9);
  fVar261 = fVar149 - *pfVar3 * 0.33333334;
  fVar271 = fVar167 - pfVar3[1] * 0.33333334;
  fVar285 = fVar182 - pfVar3[2] * 0.33333334;
  fVar305 = fVar184 - pfVar3[3] * 0.33333334;
  fVar313 = *pfVar1 * 0.33333334 + fVar222;
  fVar316 = pfVar1[1] * 0.33333334 + fVar209;
  fVar323 = pfVar1[2] * 0.33333334 + fVar218;
  fVar325 = pfVar1[3] * 0.33333334 + fVar220;
  fVar327 = fVar151 - *pfVar2 * 0.33333334;
  fVar246 = fVar164 - pfVar2[1] * 0.33333334;
  fVar249 = fVar165 - pfVar2[2] * 0.33333334;
  fVar251 = fVar187 - pfVar2[3] * 0.33333334;
  fVar235 = fVar261 * 0.0;
  fVar245 = fVar271 * 0.0;
  fVar248 = fVar285 * 0.0;
  fVar253 = fVar305 * 0.0;
  fVar254 = fVar149 * 0.0 + fVar235;
  fVar262 = fVar167 * 0.0 + fVar245;
  fVar265 = fVar182 * 0.0 + fVar248;
  fVar268 = fVar184 * 0.0 + fVar253;
  fVar272 = fVar204 * 0.0;
  fVar281 = fVar206 * 0.0;
  fVar286 = fVar233 * 0.0;
  fVar290 = fVar234 * 0.0;
  fVar264 = fVar272 + fVar254 + fVar130;
  fVar280 = fVar281 + fVar262 + fVar140;
  fVar294 = fVar286 + fVar265 + fVar141;
  fVar309 = fVar290 + fVar268 + fVar144;
  fVar204 = (fVar204 * 3.0 + fVar254) - fVar130 * 3.0;
  fVar206 = (fVar206 * 3.0 + fVar262) - fVar140 * 3.0;
  fVar233 = (fVar233 * 3.0 + fVar265) - fVar141 * 3.0;
  fVar234 = (fVar234 * 3.0 + fVar268) - fVar144 * 3.0;
  fVar273 = fVar327 * 0.0;
  fVar282 = fVar246 * 0.0;
  fVar287 = fVar249 * 0.0;
  fVar291 = fVar251 * 0.0;
  fVar254 = fVar151 * 0.0 + fVar273;
  fVar262 = fVar164 * 0.0 + fVar282;
  fVar265 = fVar165 * 0.0 + fVar287;
  fVar268 = fVar187 * 0.0 + fVar291;
  fVar295 = fVar313 * 0.0;
  fVar306 = fVar316 * 0.0;
  fVar310 = fVar323 * 0.0;
  fVar314 = fVar325 * 0.0;
  fVar317 = fVar295 + fVar254 + fVar222;
  fVar324 = fVar306 + fVar262 + fVar209;
  fVar326 = fVar310 + fVar265 + fVar218;
  fVar328 = fVar314 + fVar268 + fVar220;
  fVar313 = (fVar313 * 3.0 + fVar254) - fVar222 * 3.0;
  fVar316 = (fVar316 * 3.0 + fVar262) - fVar209 * 3.0;
  fVar323 = (fVar323 * 3.0 + fVar265) - fVar218 * 3.0;
  fVar325 = (fVar325 * 3.0 + fVar268) - fVar220 * 3.0;
  fVar235 = fVar235 + fVar149 + fVar272 + fVar130 * 0.0;
  fVar245 = fVar245 + fVar167 + fVar281 + fVar140 * 0.0;
  fVar248 = fVar248 + fVar182 + fVar286 + fVar141 * 0.0;
  fVar253 = fVar253 + fVar184 + fVar290 + fVar144 * 0.0;
  fVar130 = ((fVar149 * 3.0 - fVar261 * 3.0) + fVar272) - fVar130 * 0.0;
  fVar140 = ((fVar167 * 3.0 - fVar271 * 3.0) + fVar281) - fVar140 * 0.0;
  fVar141 = ((fVar182 * 3.0 - fVar285 * 3.0) + fVar286) - fVar141 * 0.0;
  fVar144 = ((fVar184 * 3.0 - fVar305 * 3.0) + fVar290) - fVar144 * 0.0;
  fVar285 = fVar273 + fVar151 + fVar295 + fVar222 * 0.0;
  fVar305 = fVar282 + fVar164 + fVar306 + fVar209 * 0.0;
  fVar254 = fVar287 + fVar165 + fVar310 + fVar218 * 0.0;
  fVar262 = fVar291 + fVar187 + fVar314 + fVar220 * 0.0;
  fVar149 = ((fVar151 * 3.0 - fVar327 * 3.0) + fVar295) - fVar222 * 0.0;
  fVar167 = ((fVar164 * 3.0 - fVar246 * 3.0) + fVar306) - fVar209 * 0.0;
  fVar182 = ((fVar165 * 3.0 - fVar249 * 3.0) + fVar310) - fVar218 * 0.0;
  fVar184 = ((fVar187 * 3.0 - fVar251 * 3.0) + fVar314) - fVar220 * 0.0;
  fVar327 = fVar206 * fVar317 - fVar324 * fVar204;
  fVar251 = fVar233 * fVar324 - fVar326 * fVar206;
  fVar265 = fVar204 * fVar326 - fVar317 * fVar233;
  fVar272 = fVar234 * fVar328 - fVar328 * fVar234;
  fVar261 = fVar206 * fVar313 - fVar316 * fVar204;
  fVar271 = fVar233 * fVar316 - fVar323 * fVar206;
  fVar313 = fVar204 * fVar323 - fVar313 * fVar233;
  fVar151 = fVar140 * fVar285 - fVar305 * fVar130;
  fVar165 = fVar141 * fVar305 - fVar254 * fVar140;
  fVar187 = fVar130 * fVar254 - fVar285 * fVar141;
  fVar285 = fVar144 * fVar262 - fVar262 * fVar144;
  fVar222 = fVar140 * fVar149 - fVar167 * fVar130;
  fVar167 = fVar141 * fVar167 - fVar182 * fVar140;
  fVar218 = fVar130 * fVar182 - fVar149 * fVar141;
  fVar323 = fVar265 * fVar265 + fVar251 * fVar251 + fVar327 * fVar327;
  auVar171 = ZEXT416((uint)fVar323);
  auVar63 = rsqrtss(ZEXT416((uint)fVar323),auVar171);
  fVar149 = auVar63._0_4_;
  fVar246 = fVar149 * 1.5 - fVar149 * fVar149 * fVar323 * 0.5 * fVar149;
  fVar254 = fVar327 * fVar261 + fVar265 * fVar313 + fVar251 * fVar271;
  fVar182 = fVar272 * fVar246;
  auVar63 = rcpss(auVar171,auVar171);
  fVar305 = (2.0 - fVar323 * auVar63._0_4_) * auVar63._0_4_;
  fVar316 = fVar187 * fVar187 + fVar165 * fVar165 + fVar151 * fVar151;
  auVar63 = ZEXT416((uint)fVar316);
  auVar171 = rsqrtss(ZEXT416((uint)fVar316),auVar63);
  fVar149 = auVar171._0_4_;
  fVar164 = fVar149 * 1.5 - fVar149 * fVar149 * fVar316 * 0.5 * fVar149;
  fVar249 = fVar151 * fVar222 + fVar187 * fVar218 + fVar165 * fVar167;
  fVar220 = fVar285 * fVar164;
  auVar63 = rcpss(auVar63,auVar63);
  fVar209 = (2.0 - fVar316 * auVar63._0_4_) * auVar63._0_4_;
  local_398 = fVar309 * fVar251 * fVar246;
  fStack_394 = fVar309 * fVar265 * fVar246;
  fStack_390 = fVar309 * fVar327 * fVar246;
  fStack_38c = fVar309 * fVar182;
  local_3a8 = fVar264 - local_398;
  fStack_3a4 = fVar280 - fStack_394;
  fStack_3a0 = fVar294 - fStack_390;
  fStack_39c = fVar309 - fStack_38c;
  fVar262 = fVar309 * fVar305 * (fVar323 * fVar271 - fVar254 * fVar251) * fVar246 +
            fVar234 * fVar251 * fVar246;
  fVar313 = fVar309 * fVar305 * (fVar323 * fVar313 - fVar254 * fVar265) * fVar246 +
            fVar234 * fVar265 * fVar246;
  fVar268 = fVar309 * fVar305 * (fVar323 * fVar261 - fVar254 * fVar327) * fVar246 +
            fVar234 * fVar327 * fVar246;
  local_398 = local_398 + fVar264;
  fStack_394 = fStack_394 + fVar280;
  fStack_390 = fStack_390 + fVar294;
  fStack_38c = fStack_38c + fVar309;
  fVar261 = fVar253 * fVar165 * fVar164;
  fVar264 = fVar253 * fVar187 * fVar164;
  fVar271 = fVar253 * fVar151 * fVar164;
  local_3c8 = fVar235 - fVar261;
  fStack_3c4 = fVar245 - fVar264;
  fStack_3c0 = fVar248 - fVar271;
  fStack_3bc = fVar253 - fVar253 * fVar220;
  fVar149 = fVar253 * fVar209 * (fVar316 * fVar167 - fVar249 * fVar165) * fVar164 +
            fVar144 * fVar165 * fVar164;
  fVar167 = fVar253 * fVar209 * (fVar316 * fVar218 - fVar249 * fVar187) * fVar164 +
            fVar144 * fVar187 * fVar164;
  fVar222 = fVar253 * fVar209 * (fVar316 * fVar222 - fVar249 * fVar151) * fVar164 +
            fVar144 * fVar151 * fVar164;
  fVar261 = fVar261 + fVar235;
  fVar264 = fVar264 + fVar245;
  fVar271 = fVar271 + fVar248;
  local_3b8 = (fVar204 - fVar262) * 0.33333334 + local_3a8;
  fStack_3b4 = (fVar206 - fVar313) * 0.33333334 + fStack_3a4;
  fStack_3b0 = (fVar233 - fVar268) * 0.33333334 + fStack_3a0;
  fStack_3ac = (fVar234 -
               (fVar309 * fVar305 * (fVar323 * (fVar234 * fVar325 - fVar325 * fVar234) -
                                    fVar254 * fVar272) * fVar246 + fVar234 * fVar182)) * 0.33333334
               + fStack_39c;
  local_3d8 = local_3c8 - (fVar130 - fVar149) * 0.33333334;
  fStack_3d4 = fStack_3c4 - (fVar140 - fVar167) * 0.33333334;
  fStack_3d0 = fStack_3c0 - (fVar141 - fVar222) * 0.33333334;
  fStack_3cc = fStack_3bc -
               (fVar144 -
               (fVar253 * fVar209 * (fVar316 * (fVar144 * fVar184 - fVar184 * fVar144) -
                                    fVar249 * fVar285) * fVar164 + fVar144 * fVar220)) * 0.33333334;
  fVar182 = fVar261 - (fVar149 + fVar130) * 0.33333334;
  fVar184 = fVar264 - (fVar167 + fVar140) * 0.33333334;
  fVar222 = fVar271 - (fVar222 + fVar141) * 0.33333334;
  fVar209 = local_3a8 - fVar95;
  fVar218 = fStack_3a4 - fVar128;
  fVar220 = fStack_3a0 - fVar129;
  fVar151 = fStack_39c - 0.0;
  fVar130 = pre->ray_space[k].vx.field_0.m128[0];
  fVar140 = pre->ray_space[k].vx.field_0.m128[1];
  fVar141 = pre->ray_space[k].vy.field_0.m128[0];
  fVar144 = pre->ray_space[k].vy.field_0.m128[1];
  fVar149 = pre->ray_space[k].vz.field_0.m128[0];
  fVar167 = pre->ray_space[k].vz.field_0.m128[1];
  fVar272 = fVar209 * fVar130 + fVar218 * fVar141 + fVar220 * fVar149;
  fVar273 = fVar209 * fVar140 + fVar218 * fVar144 + fVar220 * fVar167;
  local_348._0_8_ = CONCAT44(fVar273,fVar272);
  fVar281 = local_3b8 - fVar95;
  fVar286 = fStack_3b4 - fVar128;
  fVar290 = fStack_3b0 - fVar129;
  fVar282 = fVar281 * fVar130 + fVar286 * fVar141 + fVar290 * fVar149;
  fVar287 = fVar281 * fVar140 + fVar286 * fVar144 + fVar290 * fVar167;
  auVar172._4_4_ = fVar287;
  auVar172._0_4_ = fVar282;
  fVar280 = local_3d8 - fVar95;
  fVar294 = fStack_3d4 - fVar128;
  fVar309 = fStack_3d0 - fVar129;
  fVar285 = fVar280 * fVar130 + fVar294 * fVar141 + fVar309 * fVar149;
  fVar305 = fVar280 * fVar140 + fVar294 * fVar144 + fVar309 * fVar167;
  auVar110._4_4_ = fVar305;
  auVar110._0_4_ = fVar285;
  fVar234 = local_3c8 - fVar95;
  fVar245 = fStack_3c4 - fVar128;
  fVar253 = fStack_3c0 - fVar129;
  fVar235 = fVar234 * fVar130 + fVar245 * fVar141 + fVar253 * fVar149;
  fVar248 = fVar234 * fVar140 + fVar245 * fVar144 + fVar253 * fVar167;
  auVar320._4_4_ = fVar248;
  auVar320._0_4_ = fVar235;
  fVar327 = local_398 - fVar95;
  fVar249 = fStack_394 - fVar128;
  fVar254 = fStack_390 - fVar129;
  fVar246 = fVar327 * fVar130 + fVar249 * fVar141 + fVar254 * fVar149;
  fVar251 = fVar327 * fVar140 + fVar249 * fVar144 + fVar254 * fVar167;
  fVar262 = (fVar262 + fVar204) * 0.33333334 + local_398;
  fVar265 = (fVar313 + fVar206) * 0.33333334 + fStack_394;
  fVar268 = (fVar268 + fVar233) * 0.33333334 + fStack_390;
  fVar233 = fVar262 - fVar95;
  fVar316 = fVar265 - fVar128;
  fVar325 = fVar268 - fVar129;
  fVar313 = fVar233 * fVar130 + fVar316 * fVar141 + fVar325 * fVar149;
  fVar323 = fVar233 * fVar140 + fVar316 * fVar144 + fVar325 * fVar167;
  auVar172._12_4_ = fVar323;
  auVar172._8_4_ = fVar313;
  fVar164 = fVar182 - fVar95;
  fVar187 = fVar184 - fVar128;
  fVar206 = fVar222 - fVar129;
  fVar165 = fVar164 * fVar130 + fVar187 * fVar141 + fVar206 * fVar149;
  fVar204 = fVar164 * fVar140 + fVar187 * fVar144 + fVar206 * fVar167;
  fVar95 = fVar261 - fVar95;
  fVar128 = fVar264 - fVar128;
  fVar129 = fVar271 - fVar129;
  fVar141 = fVar95 * fVar130 + fVar128 * fVar141 + fVar129 * fVar149;
  fVar144 = fVar95 * fVar140 + fVar128 * fVar144 + fVar129 * fVar167;
  auVar320._12_4_ = fVar144;
  auVar320._8_4_ = fVar141;
  auVar79._8_4_ = fVar246;
  auVar79._0_8_ = local_348._0_8_;
  auVar79._12_4_ = fVar251;
  auVar63 = minps(auVar79,auVar172);
  auVar110._8_4_ = fVar165;
  auVar110._12_4_ = fVar204;
  auVar171 = minps(auVar110,auVar320);
  auVar63 = minps(auVar63,auVar171);
  auVar111._4_4_ = fVar273;
  auVar111._0_4_ = fVar272;
  auVar111._8_4_ = fVar246;
  auVar111._12_4_ = fVar251;
  auVar171 = maxps(auVar111,auVar172);
  auVar132._4_4_ = fVar305;
  auVar132._0_4_ = fVar285;
  auVar132._8_4_ = fVar165;
  auVar132._12_4_ = fVar204;
  auVar133 = maxps(auVar132,auVar320);
  auVar112 = maxps(auVar171,auVar133);
  auVar16._4_8_ = auVar133._8_8_;
  auVar16._0_4_ = auVar63._4_4_;
  auVar134._0_8_ = auVar16._0_8_ << 0x20;
  auVar134._8_4_ = auVar63._8_4_;
  auVar134._12_4_ = auVar63._12_4_;
  auVar135._8_8_ = auVar63._8_8_;
  auVar135._0_8_ = auVar134._8_8_;
  auVar171 = minps(auVar63,auVar135);
  auVar17._4_8_ = auVar63._8_8_;
  auVar17._0_4_ = auVar112._4_4_;
  auVar136._0_8_ = auVar17._0_8_ << 0x20;
  auVar136._8_4_ = auVar112._8_4_;
  auVar136._12_4_ = auVar112._12_4_;
  auVar137._8_8_ = auVar112._8_8_;
  auVar137._0_8_ = auVar136._8_8_;
  auVar63 = maxps(auVar112,auVar137);
  auVar80._0_8_ = auVar171._0_8_ & 0x7fffffff7fffffff;
  auVar80._8_4_ = auVar171._8_4_ & 0x7fffffff;
  auVar80._12_4_ = auVar171._12_4_ & 0x7fffffff;
  auVar113._0_8_ = auVar63._0_8_ & 0x7fffffff7fffffff;
  auVar113._8_4_ = auVar63._8_4_ & 0x7fffffff;
  auVar113._12_4_ = auVar63._12_4_ & 0x7fffffff;
  auVar63 = maxps(auVar80,auVar113);
  fVar140 = auVar63._4_4_;
  fVar130 = fVar140;
  if (fVar140 <= auVar63._0_4_) {
    fVar130 = auVar63._0_4_;
  }
  iVar24 = (int)local_3e0;
  fVar130 = fVar130 * 9.536743e-07;
  local_348._8_8_ = local_348._0_8_;
  auVar43._4_8_ = uStack_410;
  auVar43._0_4_ = fVar140;
  local_418 = (undefined1  [8])(auVar43._0_8_ << 0x20);
  uStack_410._0_4_ = fVar140;
  uStack_410._4_4_ = fVar140;
  local_418._4_4_ = fVar251;
  local_418._0_4_ = fVar246;
  fVar291 = local_398 - local_3a8;
  fVar295 = fStack_394 - fStack_3a4;
  fVar306 = fStack_390 - fStack_3a0;
  fVar296 = fVar262 - local_3b8;
  fVar307 = fVar265 - fStack_3b4;
  fVar311 = fVar268 - fStack_3b0;
  fVar182 = fVar182 - local_3d8;
  fVar184 = fVar184 - fStack_3d4;
  fVar310 = fVar222 - fStack_3d0;
  fVar324 = fVar261 - local_3c8;
  fVar326 = fVar264 - fStack_3c4;
  fVar328 = fVar271 - fStack_3c0;
  local_52c = 0;
  uVar50 = 0;
  fVar140 = *(float *)(ray + k * 4 + 0x30);
  fVar149 = 0.0;
  fVar167 = 1.0;
  fVar314 = 0.0;
  fVar317 = 0.0;
  local_508.lower = 0.0;
  local_508.upper = 1.0;
LAB_002f2f9b:
  do {
    fVar274 = 1.0 - fVar149;
    fVar283 = 1.0 - fVar149;
    fVar288 = 1.0 - fVar167;
    fVar292 = 1.0 - fVar167;
    fVar255 = local_348._0_4_ * fVar274 + fVar246 * fVar149;
    fVar263 = local_348._4_4_ * fVar283 + fVar251 * fVar149;
    fVar266 = local_348._8_4_ * fVar288 + fVar246 * fVar167;
    fVar269 = local_348._12_4_ * fVar292 + fVar251 * fVar167;
    fVar236 = fVar282 * fVar274 + fVar313 * fVar149;
    fVar247 = fVar287 * fVar283 + fVar323 * fVar149;
    fVar250 = fVar282 * fVar288 + fVar313 * fVar167;
    fVar252 = fVar287 * fVar292 + fVar323 * fVar167;
    fVar336 = fVar285 * fVar274 + fVar165 * fVar149;
    fVar338 = fVar305 * fVar283 + fVar204 * fVar149;
    fVar339 = fVar285 * fVar288 + fVar165 * fVar167;
    fVar340 = fVar305 * fVar292 + fVar204 * fVar167;
    fVar275 = fVar274 * fVar235 + fVar149 * fVar141;
    fVar284 = fVar283 * fVar248 + fVar149 * fVar144;
    fVar289 = fVar288 * fVar235 + fVar167 * fVar141;
    fVar293 = fVar292 * fVar248 + fVar167 * fVar144;
    fVar318 = (local_508.upper - local_508.lower) * 0.11111111;
    fVar329 = (local_508.upper - local_508.lower) * 0.0 + local_508.lower;
    fVar333 = (local_508.upper - local_508.lower) * 0.33333334 + local_508.lower;
    fVar334 = (local_508.upper - local_508.lower) * 0.6666667 + local_508.lower;
    fVar335 = (local_508.upper - local_508.lower) * 1.0 + local_508.lower;
    fVar283 = 1.0 - fVar329;
    fVar288 = 1.0 - fVar333;
    fVar142 = 1.0 - fVar334;
    fVar143 = 1.0 - fVar335;
    fVar168 = fVar236 * fVar283 + fVar336 * fVar329;
    fVar183 = fVar236 * fVar288 + fVar336 * fVar333;
    fVar185 = fVar236 * fVar142 + fVar336 * fVar334;
    fVar186 = fVar236 * fVar143 + fVar336 * fVar335;
    fVar188 = fVar247 * fVar283 + fVar338 * fVar329;
    fVar205 = fVar247 * fVar288 + fVar338 * fVar333;
    fVar207 = fVar247 * fVar142 + fVar338 * fVar334;
    fVar208 = fVar247 * fVar143 + fVar338 * fVar335;
    fVar274 = (fVar255 * fVar283 + fVar236 * fVar329) * fVar283 + fVar329 * fVar168;
    fVar292 = (fVar255 * fVar288 + fVar236 * fVar333) * fVar288 + fVar333 * fVar183;
    fVar166 = (fVar255 * fVar142 + fVar236 * fVar334) * fVar142 + fVar334 * fVar185;
    fVar236 = (fVar255 * fVar143 + fVar236 * fVar335) * fVar143 + fVar335 * fVar186;
    fVar255 = (fVar263 * fVar283 + fVar247 * fVar329) * fVar283 + fVar329 * fVar188;
    fVar219 = (fVar263 * fVar288 + fVar247 * fVar333) * fVar288 + fVar333 * fVar205;
    fVar221 = (fVar263 * fVar142 + fVar247 * fVar334) * fVar142 + fVar334 * fVar207;
    fVar263 = (fVar263 * fVar143 + fVar247 * fVar335) * fVar143 + fVar335 * fVar208;
    fVar168 = fVar168 * fVar283 + (fVar336 * fVar283 + fVar275 * fVar329) * fVar329;
    fVar183 = fVar183 * fVar288 + (fVar336 * fVar288 + fVar275 * fVar333) * fVar333;
    fVar247 = fVar185 * fVar142 + (fVar336 * fVar142 + fVar275 * fVar334) * fVar334;
    fVar186 = fVar186 * fVar143 + (fVar336 * fVar143 + fVar275 * fVar335) * fVar335;
    fVar188 = fVar188 * fVar283 + (fVar338 * fVar283 + fVar284 * fVar329) * fVar329;
    fVar205 = fVar205 * fVar288 + (fVar338 * fVar288 + fVar284 * fVar333) * fVar333;
    fVar207 = fVar207 * fVar142 + (fVar338 * fVar142 + fVar284 * fVar334) * fVar334;
    fVar208 = fVar208 * fVar143 + (fVar338 * fVar143 + fVar284 * fVar335) * fVar335;
    local_388 = fVar283 * fVar274 + fVar329 * fVar168;
    fStack_384 = fVar288 * fVar292 + fVar333 * fVar183;
    fStack_380 = fVar142 * fVar166 + fVar334 * fVar247;
    fStack_37c = fVar143 * fVar236 + fVar335 * fVar186;
    fVar297 = fVar283 * fVar255 + fVar329 * fVar188;
    fVar308 = fVar288 * fVar219 + fVar333 * fVar205;
    fVar312 = fVar142 * fVar221 + fVar334 * fVar207;
    fVar315 = fVar143 * fVar263 + fVar335 * fVar208;
    fVar185 = (fVar183 - fVar292) * 3.0 * fVar318;
    fVar247 = (fVar247 - fVar166) * 3.0 * fVar318;
    fVar236 = (fVar186 - fVar236) * 3.0 * fVar318;
    fVar186 = (fVar205 - fVar219) * 3.0 * fVar318;
    fVar205 = (fVar207 - fVar221) * 3.0 * fVar318;
    fVar207 = (fVar208 - fVar263) * 3.0 * fVar318;
    local_358._4_4_ = fStack_380;
    local_358._0_4_ = fStack_384;
    local_358._8_4_ = fStack_37c;
    local_358._12_4_ = 0;
    local_368 = local_388 + (fVar168 - fVar274) * 3.0 * fVar318;
    fStack_364 = fStack_384 + fVar185;
    fStack_360 = fStack_380 + fVar247;
    fStack_35c = fStack_37c + fVar236;
    fVar274 = fVar297 + (fVar188 - fVar255) * 3.0 * fVar318;
    fVar292 = fVar308 + fVar186;
    fVar166 = fVar312 + fVar205;
    fVar183 = fVar315 + fVar207;
    local_378._0_4_ = fStack_384 - fVar185;
    local_378._4_4_ = fStack_380 - fVar247;
    local_378._8_4_ = fStack_37c - fVar236;
    local_378._12_4_ = 0;
    auVar81._0_4_ = fVar308 - fVar186;
    auVar81._4_4_ = fVar312 - fVar205;
    auVar81._8_4_ = fVar315 - fVar207;
    auVar81._12_4_ = 0;
    fVar247 = fVar250 * fVar283 + fVar339 * fVar329;
    fVar186 = fVar250 * fVar288 + fVar339 * fVar333;
    fVar188 = fVar250 * fVar142 + fVar339 * fVar334;
    fVar205 = fVar250 * fVar143 + fVar339 * fVar335;
    fVar207 = fVar252 * fVar283 + fVar340 * fVar329;
    fVar208 = fVar252 * fVar288 + fVar340 * fVar333;
    fVar255 = fVar252 * fVar142 + fVar340 * fVar334;
    fVar219 = fVar252 * fVar143 + fVar340 * fVar335;
    fVar168 = (fVar266 * fVar283 + fVar250 * fVar329) * fVar283 + fVar329 * fVar247;
    fVar236 = (fVar266 * fVar288 + fVar250 * fVar333) * fVar288 + fVar333 * fVar186;
    fVar185 = (fVar266 * fVar142 + fVar250 * fVar334) * fVar142 + fVar334 * fVar188;
    fVar221 = (fVar266 * fVar143 + fVar250 * fVar335) * fVar143 + fVar335 * fVar205;
    fVar336 = (fVar269 * fVar283 + fVar252 * fVar329) * fVar283 + fVar329 * fVar207;
    fVar338 = (fVar269 * fVar288 + fVar252 * fVar333) * fVar288 + fVar333 * fVar208;
    fVar267 = (fVar269 * fVar142 + fVar252 * fVar334) * fVar142 + fVar334 * fVar255;
    fVar270 = (fVar269 * fVar143 + fVar252 * fVar335) * fVar143 + fVar335 * fVar219;
    fVar263 = fVar247 * fVar283 + (fVar339 * fVar283 + fVar289 * fVar329) * fVar329;
    fVar250 = fVar186 * fVar288 + (fVar339 * fVar288 + fVar289 * fVar333) * fVar333;
    fVar252 = fVar188 * fVar142 + (fVar339 * fVar142 + fVar289 * fVar334) * fVar334;
    fVar266 = fVar205 * fVar143 + (fVar339 * fVar143 + fVar289 * fVar335) * fVar335;
    fVar284 = fVar207 * fVar283 + (fVar340 * fVar283 + fVar293 * fVar329) * fVar329;
    fVar269 = fVar208 * fVar288 + (fVar340 * fVar288 + fVar293 * fVar333) * fVar333;
    fVar275 = fVar255 * fVar142 + (fVar340 * fVar142 + fVar293 * fVar334) * fVar334;
    fVar289 = fVar219 * fVar143 + (fVar340 * fVar143 + fVar293 * fVar335) * fVar335;
    fVar207 = fVar283 * fVar168 + fVar329 * fVar263;
    fVar208 = fVar288 * fVar236 + fVar333 * fVar250;
    fVar255 = fVar142 * fVar185 + fVar334 * fVar252;
    fVar219 = fVar143 * fVar221 + fVar335 * fVar266;
    fVar247 = fVar283 * fVar336 + fVar329 * fVar284;
    fVar186 = fVar288 * fVar338 + fVar333 * fVar269;
    fVar188 = fVar142 * fVar267 + fVar334 * fVar275;
    fVar205 = fVar143 * fVar270 + fVar335 * fVar289;
    fVar283 = (fVar250 - fVar236) * 3.0 * fVar318;
    fVar142 = (fVar252 - fVar185) * 3.0 * fVar318;
    fVar236 = (fVar266 - fVar221) * 3.0 * fVar318;
    fVar266 = (fVar269 - fVar338) * 3.0 * fVar318;
    fVar269 = (fVar275 - fVar267) * 3.0 * fVar318;
    fVar275 = (fVar289 - fVar270) * 3.0 * fVar318;
    fVar267 = fVar207 + (fVar263 - fVar168) * 3.0 * fVar318;
    fVar270 = fVar208 + fVar283;
    fVar293 = fVar255 + fVar142;
    fVar329 = fVar219 + fVar236;
    fVar284 = fVar247 + (fVar284 - fVar336) * 3.0 * fVar318;
    fVar289 = fVar186 + fVar266;
    fVar336 = fVar188 + fVar269;
    fVar338 = fVar205 + fVar275;
    fVar283 = fVar208 - fVar283;
    fVar142 = fVar255 - fVar142;
    fVar236 = fVar219 - fVar236;
    fVar266 = fVar186 - fVar266;
    fVar269 = fVar188 - fVar269;
    fVar275 = fVar205 - fVar275;
    fVar288 = (fVar208 - fStack_384) + (fVar207 - local_388);
    fVar143 = (fVar255 - fStack_380) + (fVar208 - fStack_384);
    fVar168 = (fVar219 - fStack_37c) + (fVar255 - fStack_380);
    fVar185 = (fVar219 - fStack_37c) + 0.0;
    fVar221 = (fVar186 - fVar308) + (fVar247 - fVar297);
    fVar263 = (fVar188 - fVar312) + (fVar186 - fVar308);
    fVar250 = (fVar205 - fVar315) + (fVar188 - fVar312);
    fVar252 = (fVar205 - fVar315) + 0.0;
    auVar211._0_8_ =
         CONCAT44(fVar308 * fVar143 - fStack_384 * fVar263,fVar297 * fVar288 - local_388 * fVar221);
    auVar211._8_4_ = fVar312 * fVar168 - fStack_380 * fVar250;
    auVar211._12_4_ = fVar315 * fVar185 - fStack_37c * fVar252;
    auVar154._0_4_ = fVar274 * fVar288 - local_368 * fVar221;
    auVar154._4_4_ = fVar292 * fVar143 - fStack_364 * fVar263;
    auVar154._8_4_ = fVar166 * fVar168 - fStack_360 * fVar250;
    auVar154._12_4_ = fVar183 * fVar185 - fStack_35c * fVar252;
    auVar173._0_8_ =
         CONCAT44(auVar81._4_4_ * fVar143 - fVar263 * local_378._4_4_,
                  auVar81._0_4_ * fVar288 - fVar221 * local_378._0_4_);
    auVar173._8_4_ = auVar81._8_4_ * fVar168 - fVar250 * local_378._8_4_;
    auVar173._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
    auVar302._0_4_ = fVar288 * fVar308 - fVar221 * fStack_384;
    auVar302._4_4_ = fVar143 * fVar312 - fVar263 * fStack_380;
    auVar302._8_4_ = fVar168 * fVar315 - fVar250 * fStack_37c;
    auVar302._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
    auVar238._0_8_ =
         CONCAT44(fVar186 * fVar143 - fVar208 * fVar263,fVar247 * fVar288 - fVar207 * fVar221);
    auVar238._8_4_ = fVar188 * fVar168 - fVar255 * fVar250;
    auVar238._12_4_ = fVar205 * fVar185 - fVar219 * fVar252;
    auVar321._0_4_ = fVar284 * fVar288 - fVar267 * fVar221;
    auVar321._4_4_ = fVar289 * fVar143 - fVar270 * fVar263;
    auVar321._8_4_ = fVar336 * fVar168 - fVar293 * fVar250;
    auVar321._12_4_ = fVar338 * fVar185 - fVar329 * fVar252;
    auVar224._0_8_ =
         CONCAT44(fVar269 * fVar143 - fVar263 * fVar142,fVar266 * fVar288 - fVar221 * fVar283);
    auVar224._8_4_ = fVar275 * fVar168 - fVar250 * fVar236;
    auVar224._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
    local_408._0_4_ = fVar288 * fVar186 - fVar221 * fVar208;
    local_408._4_4_ = fVar143 * fVar188 - fVar263 * fVar255;
    local_408._8_4_ = fVar168 * fVar205 - fVar250 * fVar219;
    local_408._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
    auVar114._8_4_ = auVar211._8_4_;
    auVar114._0_8_ = auVar211._0_8_;
    auVar114._12_4_ = auVar211._12_4_;
    auVar63 = minps(auVar114,auVar154);
    auVar112 = maxps(auVar211,auVar154);
    auVar155._8_4_ = auVar173._8_4_;
    auVar155._0_8_ = auVar173._0_8_;
    auVar155._12_4_ = auVar173._12_4_;
    auVar171 = minps(auVar155,auVar302);
    auVar63 = minps(auVar63,auVar171);
    auVar171 = maxps(auVar173,auVar302);
    auVar133 = maxps(auVar112,auVar171);
    auVar156._8_4_ = auVar238._8_4_;
    auVar156._0_8_ = auVar238._0_8_;
    auVar156._12_4_ = auVar238._12_4_;
    auVar171 = minps(auVar156,auVar321);
    auVar239 = maxps(auVar238,auVar321);
    auVar174._8_4_ = auVar224._8_4_;
    auVar174._0_8_ = auVar224._0_8_;
    auVar174._12_4_ = auVar224._12_4_;
    auVar112 = minps(auVar174,local_408);
    auVar171 = minps(auVar171,auVar112);
    auVar63 = minps(auVar63,auVar171);
    auVar171 = maxps(auVar224,local_408);
    auVar171 = maxps(auVar239,auVar171);
    auVar171 = maxps(auVar133,auVar171);
    bVar55 = auVar63._4_4_ <= fVar130;
    bVar11 = auVar63._8_4_ <= fVar130;
    auVar44._4_4_ = -(uint)bVar11;
    auVar44._0_4_ = -(uint)bVar55;
    auVar44._8_4_ = -(uint)(auVar63._12_4_ <= fVar130);
    auVar44._12_4_ = 0;
    auVar118 = auVar44 << 0x20;
    bVar46 = (-fVar130 <= auVar171._0_4_ && auVar63._0_4_ <= fVar130) && bVar13;
    auVar212._0_4_ = -(uint)bVar46;
    bVar47 = (-fVar130 <= auVar171._4_4_ && bVar55) && bVar14;
    auVar212._4_4_ = -(uint)bVar47;
    bVar55 = (-fVar130 <= auVar171._8_4_ && bVar11) && bVar15;
    auVar212._8_4_ = -(uint)bVar55;
    auVar212._12_4_ = 0;
    uVar58 = movmskps((int)uVar51,auVar212);
    uVar51 = (ulong)uVar58;
    if (uVar58 != 0) {
      fVar288 = (fVar208 - fVar207) + (fStack_384 - local_388);
      fVar143 = (fVar255 - fVar208) + (fStack_380 - fStack_384);
      fVar168 = (fVar219 - fVar255) + (fStack_37c - fStack_380);
      fVar185 = (0.0 - fVar219) + (0.0 - fStack_37c);
      fVar221 = (fVar186 - fVar247) + (fVar308 - fVar297);
      fVar263 = (fVar188 - fVar186) + (fVar312 - fVar308);
      fVar250 = (fVar205 - fVar188) + (fVar315 - fVar312);
      fVar252 = (0.0 - fVar205) + (0.0 - fVar315);
      auVar330._0_8_ =
           CONCAT44(fVar308 * fVar143 - fStack_384 * fVar263,fVar297 * fVar288 - local_388 * fVar221
                   );
      auVar330._8_4_ = fVar312 * fVar168 - fStack_380 * fVar250;
      auVar330._12_4_ = fVar315 * fVar185 - fStack_37c * fVar252;
      auVar157._0_4_ = fVar274 * fVar288 - local_368 * fVar221;
      auVar157._4_4_ = fVar292 * fVar143 - fStack_364 * fVar263;
      auVar157._8_4_ = fVar166 * fVar168 - fStack_360 * fVar250;
      auVar157._12_4_ = fVar183 * fVar185 - fStack_35c * fVar252;
      auVar225._0_8_ =
           CONCAT44(auVar81._4_4_ * fVar143 - local_378._4_4_ * fVar263,
                    auVar81._0_4_ * fVar288 - local_378._0_4_ * fVar221);
      auVar225._8_4_ = auVar81._8_4_ * fVar168 - local_378._8_4_ * fVar250;
      auVar225._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
      auVar175._0_4_ = fVar308 * fVar288 - fStack_384 * fVar221;
      auVar175._4_4_ = fVar312 * fVar143 - fStack_380 * fVar263;
      auVar175._8_4_ = fVar315 * fVar168 - fStack_37c * fVar250;
      auVar175._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
      auVar138._0_8_ =
           CONCAT44(fVar186 * fVar143 - fVar208 * fVar263,fVar247 * fVar288 - fVar207 * fVar221);
      auVar138._8_4_ = fVar188 * fVar168 - fVar255 * fVar250;
      auVar138._12_4_ = fVar205 * fVar185 - fVar219 * fVar252;
      auVar256._0_4_ = fVar284 * fVar288 - fVar267 * fVar221;
      auVar256._4_4_ = fVar289 * fVar143 - fVar270 * fVar263;
      auVar256._8_4_ = fVar336 * fVar168 - fVar293 * fVar250;
      auVar256._12_4_ = fVar338 * fVar185 - fVar329 * fVar252;
      auVar303._0_8_ =
           CONCAT44(fVar269 * fVar143 - fVar142 * fVar263,fVar266 * fVar288 - fVar283 * fVar221);
      auVar303._8_4_ = fVar275 * fVar168 - fVar236 * fVar250;
      auVar303._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
      local_408._0_4_ = fVar288 * fVar186 - fVar221 * fVar208;
      local_408._4_4_ = fVar143 * fVar188 - fVar263 * fVar255;
      local_408._8_4_ = fVar168 * fVar205 - fVar250 * fVar219;
      local_408._12_4_ = fVar185 * 0.0 - fVar252 * 0.0;
      auVar115._8_4_ = auVar330._8_4_;
      auVar115._0_8_ = auVar330._0_8_;
      auVar115._12_4_ = auVar330._12_4_;
      auVar63 = minps(auVar115,auVar157);
      auVar112 = maxps(auVar330,auVar157);
      auVar158._8_4_ = auVar225._8_4_;
      auVar158._0_8_ = auVar225._0_8_;
      auVar158._12_4_ = auVar225._12_4_;
      auVar171 = minps(auVar158,auVar175);
      auVar63 = minps(auVar63,auVar171);
      auVar171 = maxps(auVar225,auVar175);
      auVar239 = maxps(auVar112,auVar171);
      auVar159._8_4_ = auVar138._8_4_;
      auVar159._0_8_ = auVar138._0_8_;
      auVar159._12_4_ = auVar138._12_4_;
      auVar112 = minps(auVar159,auVar256);
      auVar171 = maxps(auVar138,auVar256);
      auVar176._8_4_ = auVar303._8_4_;
      auVar176._0_8_ = auVar303._0_8_;
      auVar176._12_4_ = auVar303._12_4_;
      auVar133 = minps(auVar176,local_408);
      auVar112 = minps(auVar112,auVar133);
      auVar63 = minps(auVar63,auVar112);
      auVar112 = maxps(auVar303,local_408);
      auVar171 = maxps(auVar171,auVar112);
      auVar171 = maxps(auVar239,auVar171);
      bVar11 = auVar63._4_4_ <= fVar130;
      bVar12 = auVar63._8_4_ <= fVar130;
      auVar45._4_4_ = -(uint)bVar12;
      auVar45._0_4_ = -(uint)bVar11;
      auVar45._8_4_ = -(uint)(auVar63._12_4_ <= fVar130);
      auVar45._12_4_ = 0;
      auVar118 = auVar45 << 0x20;
      auVar331._0_4_ = -(uint)((-fVar130 <= auVar171._0_4_ && auVar63._0_4_ <= fVar130) && bVar46);
      auVar331._4_4_ = -(uint)((-fVar130 <= auVar171._4_4_ && bVar11) && bVar47);
      auVar331._8_4_ = -(uint)((-fVar130 <= auVar171._8_4_ && bVar12) && bVar55);
      auVar331._12_4_ = 0;
      uVar58 = movmskps(uVar58,auVar331);
      uVar51 = (ulong)uVar58;
      if (uVar58 != 0) {
        uVar51 = (ulong)(byte)uVar58;
        mask_stack[uVar50] = uVar58 & 0xff;
        cu_stack[uVar50] = local_508;
        BVar26.upper = fVar167;
        BVar26.lower = fVar149;
        local_408._8_4_ = fVar314;
        local_408._0_4_ = fVar149;
        local_408._4_4_ = fVar167;
        local_408._12_4_ = fVar317;
        cv_stack[uVar50] = BVar26;
        uVar50 = (ulong)((int)uVar50 + 1);
      }
    }
LAB_002f3605:
    _local_518 = auVar81;
    auVar63 = _local_518;
    if ((int)uVar50 == 0) {
      if (local_52c != 0) goto LAB_002f479d;
      fVar95 = *(float *)(ray + k * 4 + 0x80);
      auVar126._4_4_ = -(uint)(fVar62 <= fVar95);
      auVar126._0_4_ = -(uint)(fVar150 <= fVar95);
      auVar126._8_4_ = -(uint)(fVar92 <= fVar95);
      auVar126._12_4_ = -(uint)(fVar93 <= fVar95);
      uVar49 = movmskps((int)uVar51,auVar126);
      local_3e0 = (ulong)((uint)local_3e0 & iVar24 + 0xfU & uVar49);
      goto LAB_002f2715;
    }
    uVar60 = (int)uVar50 - 1;
    uVar51 = (ulong)uVar60;
    uVar58 = mask_stack[uVar51];
    fVar149 = cv_stack[uVar51].lower;
    fVar167 = cv_stack[uVar51].upper;
    fVar314 = 0.0;
    fVar317 = 0.0;
    uVar10 = 0;
    if (uVar58 != 0) {
      for (; (uVar58 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar58 = uVar58 - 1 & uVar58;
    mask_stack[uVar51] = uVar58;
    if (uVar58 == 0) {
      uVar50 = (ulong)uVar60;
    }
    fVar288 = (float)(uVar10 + 1) * 0.33333334;
    fVar292 = local_408._4_4_ * 0.0;
    fVar142 = auVar118._4_4_ * 0.0;
    fVar274 = cu_stack[uVar51].lower;
    fVar283 = cu_stack[uVar51].upper;
    local_508.lower =
         fVar274 * (1.0 - (float)uVar10 * 0.33333334) + fVar283 * (float)uVar10 * 0.33333334;
    local_508.upper = fVar274 * (1.0 - fVar288) + fVar283 * fVar288;
    fVar288 = fVar274 * (0.0 - fVar292) + fVar283 * fVar292;
    fVar283 = fVar274 * (0.0 - fVar142) + fVar283 * fVar142;
    fVar274 = local_508.upper - local_508.lower;
    if (fVar274 < 0.16666667) {
      fVar247 = 1.0 - fVar149;
      fVar186 = 1.0 - fVar149;
      fVar188 = 1.0 - fVar167;
      fVar205 = 1.0 - fVar167;
      fVar143 = local_348._0_4_ * fVar247 + fVar246 * fVar149;
      fVar168 = local_348._4_4_ * fVar186 + fVar251 * fVar149;
      fVar314 = local_348._8_4_ * fVar188 + fVar246 * fVar167;
      fVar317 = local_348._12_4_ * fVar205 + fVar251 * fVar167;
      fVar292 = fVar282 * fVar247 + fVar313 * fVar149;
      fVar142 = fVar287 * fVar186 + fVar323 * fVar149;
      fVar236 = fVar282 * fVar188 + fVar313 * fVar167;
      fVar185 = fVar287 * fVar205 + fVar323 * fVar167;
      fVar266 = fVar285 * fVar247 + fVar165 * fVar149;
      fVar275 = fVar305 * fVar186 + fVar204 * fVar149;
      fVar289 = fVar285 * fVar188 + fVar165 * fVar167;
      fVar338 = fVar305 * fVar205 + fVar204 * fVar167;
      fVar255 = (fVar247 * fVar235 + fVar149 * fVar141) - fVar266;
      fVar219 = (fVar186 * fVar248 + fVar149 * fVar144) - fVar275;
      fVar250 = (fVar188 * fVar235 + fVar167 * fVar141) - fVar289;
      fVar252 = (fVar205 * fVar248 + fVar167 * fVar144) - fVar338;
      fVar247 = local_508.lower * (fVar266 - fVar292) + fVar292;
      fVar186 = local_508.lower * (fVar275 - fVar142) + fVar142;
      fVar188 = local_508.lower * (fVar289 - fVar236) + fVar236;
      fVar205 = local_508.lower * (fVar338 - fVar185) + fVar185;
      fVar269 = (fVar266 - fVar292) * local_508.upper + fVar292;
      fVar284 = (fVar275 - fVar142) * local_508.upper + fVar142;
      fVar336 = (fVar289 - fVar236) * local_508.upper + fVar236;
      fVar267 = (fVar338 - fVar185) * local_508.upper + fVar185;
      fVar207 = local_508.lower * (fVar292 - fVar143) + fVar143;
      fVar208 = local_508.lower * (fVar142 - fVar168) + fVar168;
      fVar221 = local_508.lower * (fVar236 - fVar314) + fVar314;
      fVar263 = local_508.lower * (fVar185 - fVar317) + fVar317;
      auVar226._0_4_ = (fVar247 - fVar207) * local_508.lower + fVar207;
      auVar226._4_4_ = (fVar186 - fVar208) * local_508.lower + fVar208;
      auVar226._8_4_ = (fVar188 - fVar221) * local_508.lower + fVar221;
      auVar226._12_4_ = (fVar205 - fVar263) * local_508.lower + fVar263;
      fVar247 = (((local_508.lower * fVar255 + fVar266) - fVar247) * local_508.lower + fVar247) -
                auVar226._0_4_;
      fVar186 = (((local_508.lower * fVar219 + fVar275) - fVar186) * local_508.lower + fVar186) -
                auVar226._4_4_;
      fVar221 = (((local_508.lower * fVar250 + fVar289) - fVar188) * local_508.lower + fVar188) -
                auVar226._8_4_;
      fVar263 = (((local_508.lower * fVar252 + fVar338) - fVar205) * local_508.lower + fVar205) -
                auVar226._12_4_;
      fVar188 = local_508.lower * fVar247 + auVar226._0_4_;
      fVar205 = local_508.lower * fVar186 + auVar226._4_4_;
      fVar207 = local_508.lower * fVar221 + auVar226._8_4_;
      fVar208 = local_508.lower * fVar263 + auVar226._12_4_;
      fVar143 = (fVar292 - fVar143) * local_508.upper + fVar143;
      fVar168 = (fVar142 - fVar168) * local_508.upper + fVar168;
      fVar314 = (fVar236 - fVar314) * local_508.upper + fVar314;
      fVar317 = (fVar185 - fVar317) * local_508.upper + fVar317;
      fVar143 = (fVar269 - fVar143) * local_508.upper + fVar143;
      fVar168 = (fVar284 - fVar168) * local_508.upper + fVar168;
      fVar314 = (fVar336 - fVar314) * local_508.upper + fVar314;
      fVar317 = (fVar267 - fVar317) * local_508.upper + fVar317;
      fVar292 = (((fVar255 * local_508.upper + fVar266) - fVar269) * local_508.upper + fVar269) -
                fVar143;
      fVar142 = (((fVar219 * local_508.upper + fVar275) - fVar284) * local_508.upper + fVar284) -
                fVar168;
      fVar236 = (((fVar250 * local_508.upper + fVar289) - fVar336) * local_508.upper + fVar336) -
                fVar314;
      fVar185 = (((fVar252 * local_508.upper + fVar338) - fVar267) * local_508.upper + fVar267) -
                fVar317;
      fVar143 = local_508.upper * fVar292 + fVar143;
      fVar168 = local_508.upper * fVar142 + fVar168;
      local_508.lower = local_508.upper * fVar236 + fVar314;
      local_508.upper = local_508.upper * fVar185 + fVar317;
      fVar314 = fVar274 * 0.33333334;
      fVar255 = fVar247 * 3.0 * fVar314 + fVar188;
      fVar219 = fVar186 * 3.0 * fVar314 + fVar205;
      fVar221 = fVar221 * 3.0 * fVar314 + fVar207;
      fVar263 = fVar263 * 3.0 * fVar314 + fVar208;
      fVar250 = fVar143 - fVar314 * fVar292 * 3.0;
      fVar252 = fVar168 - fVar314 * fVar142 * 3.0;
      fVar266 = local_508.lower - fVar314 * fVar236 * 3.0;
      fVar269 = local_508.upper - fVar314 * fVar185 * 3.0;
      auVar18._4_8_ = auVar226._8_8_;
      auVar18._0_4_ = fVar168;
      auVar227._0_8_ = auVar18._0_8_ << 0x20;
      auVar227._8_4_ = local_508.lower;
      auVar227._12_4_ = local_508.upper;
      fVar236 = (local_508.lower - fVar143) + (fVar207 - fVar188);
      fVar185 = (local_508.upper - fVar168) + (fVar208 - fVar205);
      auVar240._0_4_ = fVar252 * fVar185;
      auVar240._4_4_ = fVar252 * fVar185;
      auVar240._8_4_ = fVar269 * fVar185;
      auVar240._12_4_ = fVar269 * fVar185;
      fVar314 = fVar188 * fVar236 + fVar205 * fVar185;
      fVar317 = fVar207 * fVar236 + fVar208 * fVar185;
      fVar247 = fVar255 * fVar236 + fVar219 * fVar185;
      fVar186 = fVar221 * fVar236 + fVar263 * fVar185;
      fVar275 = fVar250 * fVar236 + auVar240._0_4_;
      auVar213._0_8_ = CONCAT44(fVar252 * fVar236 + auVar240._4_4_,fVar275);
      auVar213._8_4_ = fVar266 * fVar236 + auVar240._8_4_;
      auVar213._12_4_ = fVar269 * fVar236 + auVar240._12_4_;
      fVar142 = fVar236 * fVar143 + fVar185 * fVar168;
      fVar284 = fVar236 * local_508.lower + fVar185 * local_508.upper;
      auVar19._4_8_ = auVar240._8_8_;
      auVar19._0_4_ = fVar219 * fVar236 + fVar219 * fVar185;
      auVar241._0_8_ = auVar19._0_8_ << 0x20;
      auVar241._8_4_ = fVar186;
      auVar241._12_4_ = fVar263 * fVar236 + fVar263 * fVar185;
      fVar292 = fVar247;
      if (fVar247 <= fVar314) {
        fVar292 = fVar314;
        fVar314 = fVar247;
      }
      auVar242._8_8_ = auVar241._8_8_;
      auVar242._0_8_ = auVar242._8_8_;
      auVar82._8_4_ = auVar213._8_4_;
      auVar82._0_8_ = auVar213._0_8_;
      auVar82._12_4_ = auVar213._12_4_;
      if (fVar142 <= fVar275) {
        auVar82._0_4_ = fVar142;
      }
      if (auVar82._0_4_ <= fVar314) {
        fVar314 = auVar82._0_4_;
      }
      auVar20._4_8_ = auVar82._8_8_;
      auVar20._0_4_ = fVar236 * fVar168 + fVar185 * fVar168;
      auVar83._0_8_ = auVar20._0_8_ << 0x20;
      auVar83._8_4_ = fVar284;
      auVar83._12_4_ = fVar236 * local_508.upper + fVar185 * local_508.upper;
      if (fVar142 <= fVar275) {
        fVar142 = fVar275;
      }
      local_408._8_8_ = auVar83._8_8_;
      local_408._0_8_ = local_408._8_8_;
      if (fVar142 <= fVar292) {
        fVar142 = fVar292;
      }
      if (fVar186 <= fVar317) {
        auVar242._0_4_ = fVar317;
        fVar317 = fVar186;
      }
      auVar116._8_4_ = auVar213._8_4_;
      auVar116._0_8_ = auVar213._8_8_;
      auVar116._12_4_ = auVar213._12_4_;
      if (fVar284 <= auVar213._8_4_) {
        auVar116._0_4_ = fVar284;
      }
      if (auVar116._0_4_ <= fVar317) {
        fVar317 = auVar116._0_4_;
      }
      if (fVar284 <= auVar213._8_4_) {
        local_408._0_4_ = auVar213._8_4_;
      }
      if (local_408._0_4_ <= auVar242._0_4_) {
        local_408._0_4_ = auVar242._0_4_;
      }
      bVar55 = 3 < (uint)uVar50;
      uVar21 = (undefined3)(uVar60 >> 8);
      uVar51 = (ulong)CONCAT31(uVar21,bVar55);
      fVar292 = local_408._0_4_;
      if ((0.0001 <= fVar314) || (fVar292 <= -0.0001)) break;
      goto LAB_002f3959;
    }
  } while( true );
  auVar118._0_12_ = ZEXT812(0x38d1b717);
  auVar118._12_4_ = 0;
  if ((fVar317 < 0.0001 && -0.0001 < fVar142) ||
     ((fVar314 < 0.0001 && -0.0001 < fVar142 ||
      (auVar81 = _local_518, fVar317 < 0.0001 && -0.0001 < fVar292)))) {
LAB_002f3959:
    local_518 = (undefined1  [8])auVar227._8_8_;
    auVar81 = _local_518;
    bVar55 = bVar55 || fVar274 < 0.001;
    uVar51 = (ulong)CONCAT31(uVar21,bVar55);
    fVar185 = (float)(~-(uint)(fVar314 < 0.0) & 0x3f800000 | -(uint)(fVar314 < 0.0) & 0xbf800000);
    fVar247 = (float)(~-(uint)(fVar142 < 0.0) & 0x3f800000 | -(uint)(fVar142 < 0.0) & 0xbf800000);
    fVar236 = 0.0;
    if ((fVar185 == fVar247) && (!NAN(fVar185) && !NAN(fVar247))) {
      fVar236 = INFINITY;
    }
    fVar186 = 0.0;
    if ((fVar185 == fVar247) && (!NAN(fVar185) && !NAN(fVar247))) {
      fVar186 = -INFINITY;
    }
    fVar275 = (float)(~-(uint)(fVar317 < 0.0) & 0x3f800000 | -(uint)(fVar317 < 0.0) & 0xbf800000);
    if ((fVar185 != fVar275) || (fVar284 = fVar186, NAN(fVar185) || NAN(fVar275))) {
      if ((fVar317 != fVar314) || (NAN(fVar317) || NAN(fVar314))) {
        fVar317 = -fVar314 / (fVar317 - fVar314);
        fVar317 = (1.0 - fVar317) * 0.0 + fVar317;
        fVar284 = fVar317;
      }
      else {
        fVar317 = 0.0;
        if ((fVar314 != 0.0) || (fVar284 = 1.0, NAN(fVar314))) {
          fVar317 = INFINITY;
          fVar284 = -INFINITY;
        }
      }
      if (fVar317 <= fVar236) {
        fVar236 = fVar317;
      }
      if (fVar284 <= fVar186) {
        fVar284 = fVar186;
      }
    }
    fVar314 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar292 < 0.0) * 4);
    if ((fVar247 != fVar314) || (fVar317 = fVar284, NAN(fVar247) || NAN(fVar314))) {
      if ((fVar292 != fVar142) || (NAN(fVar292) || NAN(fVar142))) {
        fVar185 = -fVar142 / (fVar292 - fVar142);
        fVar185 = (1.0 - fVar185) * 0.0 + fVar185;
        fVar317 = fVar185;
      }
      else {
        fVar185 = 0.0;
        if ((fVar142 != 0.0) || (fVar317 = 1.0, NAN(fVar142))) {
          fVar185 = INFINITY;
          fVar317 = -INFINITY;
        }
      }
      if (fVar185 <= fVar236) {
        fVar236 = fVar185;
      }
      if (fVar317 <= fVar284) {
        fVar317 = fVar284;
      }
    }
    if ((fVar275 != fVar314) || (NAN(fVar275) || NAN(fVar314))) {
      fVar236 = (float)(~-(uint)(fVar236 < 1.0) & 0x3f800000 |
                       (uint)fVar236 & -(uint)(fVar236 < 1.0));
      fVar317 = (float)(~-(uint)(fVar317 < 1.0) & (uint)fVar317 |
                       -(uint)(fVar317 < 1.0) & 0x3f800000);
    }
    auVar117._0_8_ =
         CONCAT44(~-(uint)(fVar317 < 1.0),~-(uint)(fVar236 < 0.0) & (uint)fVar236) &
         0x3f800000ffffffff;
    auVar117._8_8_ = 0;
    auVar118 = auVar117 | ZEXT416((uint)fVar317 & -(uint)(fVar317 < 1.0)) << 0x20;
    fVar314 = auVar118._4_4_;
    local_408._4_4_ = fVar314;
    local_408._0_4_ = fVar314;
    local_408._8_4_ = fVar314;
    local_408._12_4_ = fVar314;
    fStack_510 = auVar63._8_4_;
    fStack_50c = auVar63._12_4_;
    if (auVar118._0_4_ <= fVar314) {
      fVar142 = auVar118._0_4_ + -0.1;
      fVar317 = auVar118._8_4_ + 0.0;
      fVar185 = auVar118._12_4_ + 0.0;
      uVar58 = -(uint)(fVar314 + 0.1 < 1.0);
      fVar142 = (float)(~-(uint)(fVar142 < 0.0) & (uint)fVar142);
      fVar236 = (float)(~uVar58 & 0x3f800000 | (uint)(fVar314 + 0.1) & uVar58);
      fVar314 = 1.0 - fVar142;
      fVar289 = 1.0 - fVar142;
      fVar336 = 1.0 - fVar236;
      fVar338 = 1.0 - fVar236;
      fVar247 = fVar188 * fVar314 + fVar207 * fVar142;
      fVar186 = fVar205 * fVar289 + fVar208 * fVar142;
      fVar188 = fVar188 * fVar336 + fVar166 * fVar236;
      fVar205 = fVar205 * fVar338 + fVar183 * fVar236;
      fVar275 = fVar255 * fVar314 + fVar221 * fVar142;
      fVar284 = fVar219 * fVar289 + fVar263 * fVar142;
      fVar255 = fVar255 * fVar336 + fVar221 * fVar236;
      fVar219 = fVar219 * fVar338 + fVar263 * fVar236;
      fVar221 = fVar250 * fVar314 + fVar266 * fVar142;
      fVar263 = fVar252 * fVar289 + fVar269 * fVar142;
      fVar250 = fVar250 * fVar336 + fVar266 * fVar236;
      fVar252 = fVar252 * fVar338 + fVar269 * fVar236;
      fVar266 = fVar314 * fVar143 + local_508.lower * fVar142;
      fVar269 = fVar289 * fVar168 + local_508.upper * fVar142;
      fVar289 = fVar336 * fVar143 + fStack_510 * fVar236;
      fVar336 = fVar338 * fVar168 + fStack_50c * fVar236;
      fVar143 = fVar167 * fVar317;
      fVar168 = fVar167 * fVar185;
      fVar338 = fVar149 * (1.0 - fVar236);
      fVar314 = fVar149 * (0.0 - fVar317);
      fVar317 = fVar149 * (0.0 - fVar185);
      fVar149 = fVar149 * (1.0 - fVar142) + fVar167 * fVar142;
      fVar167 = fVar338 + fVar167 * fVar236;
      fVar314 = fVar314 + fVar143;
      fVar317 = fVar317 + fVar168;
      fVar274 = 1.0 / fVar274;
      auVar119._0_4_ = fVar289 - fVar266;
      auVar119._4_4_ = fVar336 - fVar269;
      auVar119._8_4_ = fVar289 - fVar289;
      auVar119._12_4_ = fVar336 - fVar336;
      auVar147._0_8_ = CONCAT44(fVar252 - fVar263,fVar250 - fVar221);
      auVar147._8_4_ = fVar250 - fVar250;
      auVar147._12_4_ = fVar252 - fVar252;
      auVar177._0_4_ = fVar255 - fVar275;
      auVar177._4_4_ = fVar219 - fVar284;
      auVar177._8_4_ = fVar255 - fVar255;
      auVar177._12_4_ = fVar219 - fVar219;
      auVar243._0_8_ = CONCAT44((fVar284 - fVar186) * 3.0,(fVar275 - fVar247) * 3.0);
      auVar243._8_4_ = (fVar255 - fVar188) * 3.0;
      auVar243._12_4_ = (fVar219 - fVar205) * 3.0;
      auVar160._0_8_ = CONCAT44((fVar263 - fVar284) * 3.0,(fVar221 - fVar275) * 3.0);
      auVar160._8_4_ = (fVar250 - fVar255) * 3.0;
      auVar160._12_4_ = (fVar252 - fVar219) * 3.0;
      auVar276._0_4_ = (fVar266 - fVar221) * 3.0;
      auVar276._4_4_ = (fVar269 - fVar263) * 3.0;
      auVar276._8_4_ = (fVar289 - fVar250) * 3.0;
      auVar276._12_4_ = (fVar336 - fVar252) * 3.0;
      auVar214._8_4_ = auVar160._8_4_;
      auVar214._0_8_ = auVar160._0_8_;
      auVar214._12_4_ = auVar160._12_4_;
      auVar171 = minps(auVar214,auVar276);
      auVar63 = maxps(auVar160,auVar276);
      auVar257._8_4_ = auVar243._8_4_;
      auVar257._0_8_ = auVar243._0_8_;
      auVar257._12_4_ = auVar243._12_4_;
      auVar133 = minps(auVar257,auVar171);
      auVar112 = maxps(auVar243,auVar63);
      auVar22._4_8_ = auVar63._8_8_;
      auVar22._0_4_ = auVar133._4_4_;
      auVar161._0_8_ = auVar22._0_8_ << 0x20;
      auVar161._8_4_ = auVar133._8_4_;
      auVar161._12_4_ = auVar133._12_4_;
      auVar162._8_8_ = auVar133._8_8_;
      auVar162._0_8_ = auVar161._8_8_;
      auVar23._4_8_ = auVar171._8_8_;
      auVar23._0_4_ = auVar112._4_4_;
      auVar215._0_8_ = auVar23._0_8_ << 0x20;
      auVar215._8_4_ = auVar112._8_4_;
      auVar215._12_4_ = auVar112._12_4_;
      auVar216._8_8_ = auVar112._8_8_;
      auVar216._0_8_ = auVar215._8_8_;
      auVar171 = minps(auVar133,auVar162);
      auVar63 = maxps(auVar112,auVar216);
      fVar267 = auVar171._0_4_ * fVar274;
      fVar270 = auVar171._4_4_ * fVar274;
      fVar293 = auVar171._8_4_ * fVar274;
      fVar297 = auVar171._12_4_ * fVar274;
      fVar221 = fVar274 * auVar63._0_4_;
      fVar250 = fVar274 * auVar63._4_4_;
      fVar266 = fVar274 * auVar63._8_4_;
      fVar274 = fVar274 * auVar63._12_4_;
      fVar336 = 1.0 / (fVar167 - fVar149);
      auVar84._0_8_ = CONCAT44(fVar205 - fVar186,fVar188 - fVar247);
      auVar84._8_4_ = fVar188 - fVar188;
      auVar84._12_4_ = fVar205 - fVar205;
      auVar228._8_4_ = auVar84._8_4_;
      auVar228._0_8_ = auVar84._0_8_;
      auVar228._12_4_ = auVar84._12_4_;
      auVar112 = minps(auVar228,auVar177);
      auVar63 = maxps(auVar84,auVar177);
      auVar139._8_4_ = auVar147._8_4_;
      auVar139._0_8_ = auVar147._0_8_;
      auVar139._12_4_ = auVar147._12_4_;
      auVar171 = minps(auVar139,auVar119);
      auVar112 = minps(auVar112,auVar171);
      auVar171 = maxps(auVar147,auVar119);
      auVar63 = maxps(auVar63,auVar171);
      fVar284 = auVar112._0_4_ * fVar336;
      fVar289 = auVar112._4_4_ * fVar336;
      fVar338 = fVar336 * auVar63._0_4_;
      fVar336 = fVar336 * auVar63._4_4_;
      local_518._4_4_ = fVar149;
      local_518._0_4_ = local_508.lower;
      fStack_510 = local_508.upper;
      fStack_50c = fVar167;
      auVar217._4_4_ = fVar167;
      auVar217._0_4_ = local_508.upper;
      auVar217._8_4_ = fVar288;
      auVar217._12_4_ = fVar283;
      local_b8 = (local_508.lower + local_508.upper) * 0.5;
      fVar205 = (fVar149 + fVar167) * 0.5;
      fVar255 = (local_508.upper + fVar288) * 0.0;
      fVar219 = (fVar167 + fVar283) * 0.0;
      fVar142 = (fVar282 - fVar272) * local_b8 + fVar272;
      fVar143 = (fVar287 - fVar273) * local_b8 + fVar273;
      fVar236 = (fVar313 - fVar246) * local_b8 + p00_1.field_0.v[2];
      fVar168 = (fVar323 - fVar251) * local_b8 + p00_1.field_0.v[3];
      fVar185 = (fVar285 - fVar282) * local_b8 + fVar165;
      fVar247 = (fVar305 - fVar287) * local_b8 + fVar204;
      fVar186 = (fVar165 - fVar313) * local_b8 + fVar313;
      fVar188 = (fVar204 - fVar323) * local_b8 + fVar323;
      fVar142 = (fVar185 - fVar142) * local_b8 + fVar142;
      fVar143 = (fVar247 - fVar143) * local_b8 + fVar143;
      fVar236 = (fVar186 - fVar236) * local_b8 + fVar236;
      fVar168 = (fVar188 - fVar168) * local_b8 + fVar168;
      fVar185 = ((((fVar235 - fVar285) * local_b8 + fVar285) - fVar185) * local_b8 + fVar185) -
                fVar142;
      fVar247 = ((((fVar248 - fVar305) * local_b8 + fVar305) - fVar247) * local_b8 + fVar247) -
                fVar143;
      fVar186 = ((((fVar141 - fVar165) * local_b8 + p02.field_0.v[2]) - fVar186) * local_b8 +
                fVar186) - fVar236;
      fVar188 = ((((fVar144 - fVar204) * local_b8 + p02.field_0.v[3]) - fVar188) * local_b8 +
                fVar188) - fVar168;
      fVar142 = local_b8 * fVar185 + fVar142;
      fVar143 = local_b8 * fVar247 + fVar143;
      fVar185 = fVar185 * 3.0;
      fVar247 = fVar247 * 3.0;
      fVar236 = (local_b8 * fVar186 + fVar236) - fVar142;
      fVar168 = (local_b8 * fVar188 + fVar168) - fVar143;
      fVar185 = (fVar186 * 3.0 - fVar185) * fVar205 + fVar185;
      fVar247 = (fVar188 * 3.0 - fVar247) * fVar205 + fVar247;
      auVar148._0_8_ = CONCAT44(fVar185,fVar236) ^ 0x80000000;
      auVar148._8_4_ = fVar185;
      auVar148._12_4_ = fVar185;
      fVar308 = local_508.lower - local_b8;
      fVar312 = fVar149 - fVar205;
      fVar315 = local_508.upper - fVar255;
      fVar318 = fVar167 - fVar219;
      fVar329 = local_508.upper - local_b8;
      fVar333 = fVar167 - fVar205;
      fVar288 = fVar288 - fVar255;
      fVar283 = fVar283 - fVar219;
      fVar142 = fVar236 * fVar205 + fVar142;
      fVar143 = fVar168 * fVar205 + fVar143;
      auVar163._0_8_ = CONCAT44(fVar247,fVar168) ^ 0x8000000000000000;
      auVar163._8_4_ = -fVar247;
      auVar163._12_4_ = -fVar247;
      auVar85._0_4_ = fVar168 * fVar185 - fVar247 * fVar236;
      auVar85._4_4_ = auVar85._0_4_;
      auVar85._8_4_ = auVar85._0_4_;
      auVar85._12_4_ = auVar85._0_4_;
      auVar171 = divps(auVar163,auVar85);
      auVar63 = divps(auVar148,auVar85);
      fVar255 = auVar171._0_4_;
      fVar219 = auVar171._4_4_;
      fVar186 = auVar63._0_4_;
      fVar188 = auVar63._4_4_;
      local_b8 = local_b8 - (fVar143 * fVar186 + fVar142 * fVar255);
      fVar185 = fVar205 - (fVar143 * fVar188 + fVar142 * fVar219);
      fVar247 = fVar205 - (fVar143 * auVar63._8_4_ + fVar142 * auVar171._8_4_);
      fVar205 = fVar205 - (fVar143 * auVar63._12_4_ + fVar142 * auVar171._12_4_);
      auVar120._0_8_ = CONCAT44(fVar219 * fVar284,fVar219 * fVar267);
      auVar120._8_4_ = fVar219 * fVar270;
      auVar120._12_4_ = fVar219 * fVar289;
      auVar86._0_4_ = fVar219 * fVar221;
      auVar86._4_4_ = fVar219 * fVar338;
      auVar86._8_4_ = fVar219 * fVar250;
      auVar86._12_4_ = fVar219 * fVar336;
      auVar337._8_4_ = auVar120._8_4_;
      auVar337._0_8_ = auVar120._0_8_;
      auVar337._12_4_ = auVar120._12_4_;
      auVar133 = minps(auVar337,auVar86);
      auVar63 = maxps(auVar86,auVar120);
      auVar178._0_8_ = CONCAT44(fVar188 * fVar289,fVar188 * fVar270);
      auVar178._8_4_ = fVar188 * fVar293;
      auVar178._12_4_ = fVar188 * fVar297;
      auVar121._0_4_ = fVar188 * fVar250;
      auVar121._4_4_ = fVar188 * fVar336;
      auVar121._8_4_ = fVar188 * fVar266;
      auVar121._12_4_ = fVar188 * fVar274;
      auVar258._8_4_ = auVar178._8_4_;
      auVar258._0_8_ = auVar178._0_8_;
      auVar258._12_4_ = auVar178._12_4_;
      auVar112 = minps(auVar258,auVar121);
      auVar171 = maxps(auVar121,auVar178);
      fVar142 = 0.0 - (auVar171._0_4_ + auVar63._0_4_);
      fVar143 = 1.0 - (auVar171._4_4_ + auVar63._4_4_);
      fVar236 = 0.0 - (auVar171._8_4_ + auVar63._8_4_);
      fVar168 = 0.0 - (auVar171._12_4_ + auVar63._12_4_);
      fVar263 = 0.0 - (auVar112._0_4_ + auVar133._0_4_);
      fVar252 = 1.0 - (auVar112._4_4_ + auVar133._4_4_);
      fVar269 = 0.0 - (auVar112._8_4_ + auVar133._8_4_);
      fVar275 = 0.0 - (auVar112._12_4_ + auVar133._12_4_);
      auVar122._0_8_ = CONCAT44(fVar312 * fVar143,fVar308 * fVar142);
      auVar122._8_4_ = fVar315 * fVar236;
      auVar122._12_4_ = fVar318 * fVar168;
      auVar277._0_8_ = CONCAT44(fVar284 * fVar255,fVar267 * fVar255);
      auVar277._8_4_ = fVar270 * fVar255;
      auVar277._12_4_ = fVar289 * fVar255;
      auVar179._0_4_ = fVar255 * fVar221;
      auVar179._4_4_ = fVar255 * fVar338;
      auVar179._8_4_ = fVar255 * fVar250;
      auVar179._12_4_ = fVar255 * fVar336;
      auVar259._8_4_ = auVar277._8_4_;
      auVar259._0_8_ = auVar277._0_8_;
      auVar259._12_4_ = auVar277._12_4_;
      auVar171 = minps(auVar259,auVar179);
      auVar63 = maxps(auVar179,auVar277);
      auVar229._0_8_ = CONCAT44(fVar289 * fVar186,fVar270 * fVar186);
      auVar229._8_4_ = fVar293 * fVar186;
      auVar229._12_4_ = fVar297 * fVar186;
      auVar278._0_4_ = fVar186 * fVar250;
      auVar278._4_4_ = fVar186 * fVar336;
      auVar278._8_4_ = fVar186 * fVar266;
      auVar278._12_4_ = fVar186 * fVar274;
      auVar332._8_4_ = auVar229._8_4_;
      auVar332._0_8_ = auVar229._0_8_;
      auVar332._12_4_ = auVar229._12_4_;
      auVar133 = minps(auVar332,auVar278);
      auVar260._0_4_ = fVar308 * fVar263;
      auVar260._4_4_ = fVar312 * fVar252;
      auVar260._8_4_ = fVar315 * fVar269;
      auVar260._12_4_ = fVar318 * fVar275;
      auVar87._0_8_ = CONCAT44(fVar143 * fVar333,fVar142 * fVar329);
      auVar87._8_4_ = fVar236 * fVar288;
      auVar87._12_4_ = fVar168 * fVar283;
      auVar203._0_4_ = fVar263 * fVar329;
      auVar203._4_4_ = fVar252 * fVar333;
      auVar203._8_4_ = fVar269 * fVar288;
      auVar203._12_4_ = fVar275 * fVar283;
      auVar112 = maxps(auVar278,auVar229);
      fVar274 = 1.0 - (auVar112._0_4_ + auVar63._0_4_);
      fVar142 = 0.0 - (auVar112._4_4_ + auVar63._4_4_);
      fVar143 = 0.0 - (auVar112._8_4_ + auVar63._8_4_);
      fVar236 = 0.0 - (auVar112._12_4_ + auVar63._12_4_);
      fVar168 = 1.0 - (auVar133._0_4_ + auVar171._0_4_);
      fVar221 = 0.0 - (auVar133._4_4_ + auVar171._4_4_);
      fVar263 = 0.0 - (auVar133._8_4_ + auVar171._8_4_);
      fVar250 = 0.0 - (auVar133._12_4_ + auVar171._12_4_);
      auVar230._0_8_ = CONCAT44(fVar312 * fVar142,fVar308 * fVar274);
      auVar230._8_4_ = fVar315 * fVar143;
      auVar230._12_4_ = fVar318 * fVar236;
      auVar304._0_4_ = fVar308 * fVar168;
      auVar304._4_4_ = fVar312 * fVar221;
      auVar304._8_4_ = fVar315 * fVar263;
      auVar304._12_4_ = fVar318 * fVar250;
      auVar180._0_8_ = CONCAT44(fVar142 * fVar333,fVar274 * fVar329);
      auVar180._8_4_ = fVar143 * fVar288;
      auVar180._12_4_ = fVar236 * fVar283;
      auVar244._0_4_ = fVar168 * fVar329;
      auVar244._4_4_ = fVar221 * fVar333;
      auVar244._8_4_ = fVar263 * fVar288;
      auVar244._12_4_ = fVar250 * fVar283;
      auVar279._8_4_ = auVar230._8_4_;
      auVar279._0_8_ = auVar230._0_8_;
      auVar279._12_4_ = auVar230._12_4_;
      auVar63 = minps(auVar279,auVar304);
      auVar322._8_4_ = auVar180._8_4_;
      auVar322._0_8_ = auVar180._0_8_;
      auVar322._12_4_ = auVar180._12_4_;
      auVar171 = minps(auVar322,auVar244);
      auVar239 = minps(auVar63,auVar171);
      auVar171 = maxps(auVar304,auVar230);
      auVar63 = maxps(auVar244,auVar180);
      auVar112 = maxps(auVar63,auVar171);
      auVar231._8_4_ = auVar122._8_4_;
      auVar231._0_8_ = auVar122._0_8_;
      auVar231._12_4_ = auVar122._12_4_;
      auVar171 = minps(auVar231,auVar260);
      auVar181._8_4_ = auVar87._8_4_;
      auVar181._0_8_ = auVar87._0_8_;
      auVar181._12_4_ = auVar87._12_4_;
      auVar63 = minps(auVar181,auVar203);
      auVar171 = minps(auVar171,auVar63);
      auVar133 = maxps(auVar260,auVar122);
      auVar63 = maxps(auVar203,auVar87);
      auVar63 = maxps(auVar63,auVar133);
      auVar232._0_4_ = auVar239._4_4_ + auVar239._0_4_ + local_b8;
      auVar232._4_4_ = auVar171._4_4_ + auVar171._0_4_ + fVar185;
      auVar232._8_4_ = auVar239._8_4_ + auVar239._4_4_ + fVar247;
      auVar232._12_4_ = auVar239._12_4_ + auVar171._4_4_ + fVar205;
      fVar274 = auVar112._4_4_ + auVar112._0_4_ + local_b8;
      fVar283 = auVar63._4_4_ + auVar63._0_4_ + fVar185;
      auVar88._4_4_ = fVar283;
      auVar88._0_4_ = fVar274;
      auVar118 = maxps(_local_518,auVar232);
      auVar88._8_4_ = auVar112._8_4_ + auVar112._4_4_ + fVar247;
      auVar88._12_4_ = auVar112._12_4_ + auVar63._4_4_ + fVar205;
      auVar63 = minps(auVar88,auVar217);
      iVar57 = -(uint)(auVar63._0_4_ < auVar118._0_4_);
      iVar59 = -(uint)(auVar63._4_4_ < auVar118._4_4_);
      auVar89._4_4_ = iVar59;
      auVar89._0_4_ = iVar57;
      auVar89._8_4_ = iVar59;
      auVar89._12_4_ = iVar59;
      local_408._8_8_ = auVar89._8_8_;
      local_408._4_4_ = (float)iVar57;
      local_408._0_4_ = (float)iVar57;
      iVar57 = movmskpd((uint)(fVar292 < 0.0),local_408);
      auVar81 = _local_518;
      if (iVar57 == 0) {
        bVar48 = 0;
        if ((local_508.lower < auVar232._0_4_) && (fVar274 < local_508.upper)) {
          bVar48 = -(fVar283 < fVar167) & fVar149 < auVar232._4_4_;
        }
        bVar48 = bVar55 | bVar48;
        uVar51 = (ulong)CONCAT31(uVar21,bVar48);
        if (bVar48 != 1) goto LAB_002f2f9b;
        uVar51 = 0xc9;
        do {
          uVar51 = uVar51 - 1;
          if (uVar51 == 0) goto LAB_002f3605;
          fVar167 = 1.0 - local_b8;
          fVar274 = local_b8 * local_b8 * local_b8;
          fVar317 = local_b8 * local_b8 * 3.0 * fVar167;
          fVar149 = fVar167 * fVar167 * fVar167;
          fVar283 = local_b8 * 3.0 * fVar167 * fVar167;
          fVar167 = fVar149 * fVar272 + fVar283 * fVar165 + fVar317 * fVar285 + fVar274 * fVar235;
          fVar314 = fVar149 * fVar273 + fVar283 * fVar204 + fVar317 * fVar305 + fVar274 * fVar248;
          fVar167 = ((fVar149 * p00_1.field_0.v[2] +
                     fVar283 * fVar313 + fVar317 * p02.field_0.v[2] + fVar274 * fVar141) - fVar167)
                    * fVar185 + fVar167;
          fVar314 = ((fVar149 * p00_1.field_0.v[3] +
                     fVar283 * fVar323 + fVar317 * p02.field_0.v[3] + fVar274 * fVar144) - fVar314)
                    * fVar185 + fVar314;
          local_b8 = local_b8 - (fVar314 * fVar186 + fVar167 * fVar255);
          fVar185 = fVar185 - (fVar314 * fVar188 + fVar167 * fVar219);
          fVar149 = ABS(fVar314);
          auVar118._0_8_ = CONCAT44(fVar314,fVar314) & 0x7fffffff7fffffff;
          auVar118._8_4_ = (int)fVar149;
          auVar118._12_4_ = (int)fVar149;
          if (fVar149 <= ABS(fVar167)) {
            auVar118._0_4_ = ABS(fVar167);
          }
          local_408 = _local_418;
        } while (fVar246 <= auVar118._0_4_);
        if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) &&
            (local_408._4_4_ = fVar185, local_408._0_4_ = fVar185, local_408._8_4_ = fVar185,
            local_408._12_4_ = fVar185, 0.0 <= fVar185)) && (fVar185 <= 1.0)) {
          fVar149 = pre->ray_space[k].vx.field_0.m128[2];
          fVar167 = pre->ray_space[k].vy.field_0.m128[2];
          fVar314 = pre->ray_space[k].vz.field_0.m128[2];
          auVar123._0_4_ = fVar209 * fVar149;
          auVar123._4_4_ = fVar218 * fVar167;
          auVar123._8_4_ = fVar220 * fVar314;
          auVar123._12_4_ = fVar151 * 0.0;
          auVar124._8_8_ = auVar123._8_8_;
          auVar124._0_8_ = auVar124._8_8_;
          auVar118._4_12_ = auVar124._4_12_;
          fVar142 = 1.0 - fVar185;
          fVar292 = 1.0 - local_b8;
          fVar317 = fVar292 * fVar292 * fVar292;
          fVar274 = local_b8 * 3.0 * fVar292 * fVar292;
          fVar288 = local_b8 * local_b8 * local_b8;
          fVar283 = local_b8 * local_b8 * 3.0 * fVar292;
          auVar118._0_4_ =
               ((auVar123._8_4_ + auVar123._4_4_ + auVar123._0_4_) * fVar142 +
               (fVar254 * fVar314 + fVar249 * fVar167 + fVar327 * fVar149) * fVar185) * fVar317 +
               ((fVar290 * fVar314 + fVar286 * fVar167 + fVar281 * fVar149) * fVar142 +
               (fVar325 * fVar314 + fVar316 * fVar167 + fVar233 * fVar149) * fVar185) * fVar274 +
               ((fVar309 * fVar314 + fVar294 * fVar167 + fVar280 * fVar149) * fVar142 +
               (fVar206 * fVar314 + fVar187 * fVar167 + fVar164 * fVar149) * fVar185) * fVar283 +
               (fVar142 * (fVar253 * fVar314 + fVar245 * fVar167 + fVar234 * fVar149) +
               (fVar314 * fVar129 + fVar167 * fVar128 + fVar149 * fVar95) * fVar185) * fVar288;
          if ((fVar140 <= auVar118._0_4_) &&
             (fVar149 = *(float *)(ray + k * 4 + 0x80), auVar118._0_4_ <= fVar149)) {
            fVar143 = 1.0 - fVar185;
            fVar236 = 1.0 - fVar185;
            fVar168 = 1.0 - fVar185;
            fVar167 = local_3b8 * fVar143 + fVar262 * fVar185;
            fVar314 = fStack_3b4 * fVar236 + fVar265 * fVar185;
            fVar142 = fStack_3b0 * fVar168 + fVar268 * fVar185;
            fVar247 = local_3d8 * fVar143 + fVar207 * fVar185;
            fVar188 = fStack_3d4 * fVar236 + fVar208 * fVar185;
            fVar207 = fStack_3d0 * fVar168 + fVar222 * fVar185;
            fVar186 = fVar247 - fVar167;
            fVar205 = fVar188 - fVar314;
            fVar208 = fVar207 - fVar142;
            fVar167 = (((fVar167 - (local_3a8 * fVar143 + local_398 * fVar185)) * fVar292 +
                       local_b8 * fVar186) * fVar292 +
                      (fVar186 * fVar292 +
                      ((fVar143 * local_3c8 + fVar261 * fVar185) - fVar247) * local_b8) * local_b8)
                      * 3.0;
            fVar314 = (((fVar314 - (fStack_3a4 * fVar236 + fStack_394 * fVar185)) * fVar292 +
                       local_b8 * fVar205) * fVar292 +
                      (fVar205 * fVar292 +
                      ((fVar236 * fStack_3c4 + fVar264 * fVar185) - fVar188) * local_b8) * local_b8)
                      * 3.0;
            fVar292 = (((fVar142 - (fStack_3a0 * fVar168 + fStack_390 * fVar185)) * fVar292 +
                       local_b8 * fVar208) * fVar292 +
                      (fVar208 * fVar292 +
                      ((fVar168 * fStack_3c0 + fVar271 * fVar185) - fVar207) * local_b8) * local_b8)
                      * 3.0;
            pGVar6 = (context->scene->geometries).items[uVar49].ptr;
            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              uVar51 = 0;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (uVar51 = CONCAT71((int7)((ulong)context->args >> 8),1),
                    pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar142 = fVar317 * fVar291 +
                        fVar274 * fVar296 + fVar283 * fVar182 + fVar288 * fVar324;
              fVar143 = fVar317 * fVar295 +
                        fVar274 * fVar307 + fVar283 * fVar184 + fVar288 * fVar326;
              fVar317 = fVar317 * fVar306 +
                        fVar274 * fVar311 + fVar283 * fVar310 + fVar288 * fVar328;
              local_c8 = fVar143 * fVar167 - fVar314 * fVar142;
              local_e8 = fVar317 * fVar314 - fVar292 * fVar143;
              local_d8 = fVar142 * fVar292 - fVar167 * fVar317;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              fStack_b4 = local_b8;
              fStack_b0 = local_b8;
              fStack_ac = local_b8;
              local_a8 = local_408;
              local_98 = CONCAT44(uVar56,uVar56);
              uStack_90 = CONCAT44(uVar56,uVar56);
              local_88 = CONCAT44(uVar49,uVar49);
              uStack_80 = CONCAT44(uVar49,uVar49);
              local_78 = context->user->instID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_68 = context->user->instPrimID[0];
              uStack_64 = local_68;
              uStack_60 = local_68;
              uStack_5c = local_68;
              *(float *)(ray + k * 4 + 0x80) = auVar118._0_4_;
              local_408 = *local_3f0;
              args.valid = (int *)local_408;
              args.geometryUserPtr = pGVar6->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_e8;
              args.N = 4;
              p_Var52 = pGVar6->occlusionFilterN;
              if (p_Var52 != (RTCFilterFunctionN)0x0) {
                p_Var52 = (RTCFilterFunctionN)(*p_Var52)(&args);
              }
              auVar125._0_4_ = -(uint)(local_408._0_4_ == 0);
              auVar125._4_4_ = -(uint)(local_408._4_4_ == 0);
              auVar125._8_4_ = -(uint)(local_408._8_4_ == 0);
              auVar125._12_4_ = -(uint)(local_408._12_4_ == 0);
              uVar58 = movmskps((int)p_Var52,auVar125);
              pRVar53 = (RTCRayN *)(ulong)(uVar58 ^ 0xf);
              if ((uVar58 ^ 0xf) == 0) {
                auVar125 = auVar125 ^ _DAT_01f46b70;
              }
              else {
                p_Var52 = context->args->filter;
                if ((p_Var52 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var52)(&args);
                }
                auVar90._0_4_ = -(uint)(local_408._0_4_ == 0);
                auVar90._4_4_ = -(uint)(local_408._4_4_ == 0);
                auVar90._8_4_ = -(uint)(local_408._8_4_ == 0);
                auVar90._12_4_ = -(uint)(local_408._12_4_ == 0);
                auVar125 = auVar90 ^ _DAT_01f46b70;
                local_408 = ~auVar90 & _DAT_01f45a40 |
                            *(undefined1 (*) [16])(args.ray + 0x80) & auVar90;
                *(undefined1 (*) [16])(args.ray + 0x80) = local_408;
                pRVar53 = args.ray;
              }
              auVar118._0_4_ = (float)(auVar125._0_4_ << 0x1f);
              auVar118._4_4_ = auVar125._4_4_ << 0x1f;
              auVar118._8_4_ = auVar125._8_4_ << 0x1f;
              auVar118._12_4_ = auVar125._12_4_ << 0x1f;
              iVar57 = movmskps((int)pRVar53,auVar118);
              uVar51 = (ulong)CONCAT31((int3)((uint)iVar57 >> 8),iVar57 != 0);
              if (iVar57 == 0) {
                *(float *)(ray + k * 4 + 0x80) = fVar149;
              }
            }
            local_52c = local_52c | (byte)uVar51;
          }
        }
      }
    }
  }
  goto LAB_002f3605;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }